

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  byte bVar87;
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  ulong uVar93;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  long lVar94;
  uint uVar95;
  ulong uVar96;
  byte bVar97;
  float fVar98;
  float fVar99;
  float fVar150;
  float fVar151;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar106 [16];
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar158;
  undefined4 uVar159;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined8 uVar160;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar188;
  undefined1 auVar187 [64];
  float fVar189;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  uint uVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_740;
  long local_710;
  undefined1 (*local_708) [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  int local_47c;
  undefined1 local_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  byte local_430;
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2e0;
  int iStack_2dc;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar93 = (ulong)(byte)PVar9;
  lVar72 = uVar93 * 0x19;
  fVar189 = *(float *)(prim + lVar72 + 0x12);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar104 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar105 = vsubps_avx(auVar22,*(undefined1 (*) [16])(prim + lVar72 + 6));
  fVar177 = fVar189 * auVar105._0_4_;
  fVar158 = fVar189 * auVar104._0_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar22);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar110 = vpmovsxbd_avx2(auVar103);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar122 = vpmovsxbd_avx2(auVar102);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar123 = vpmovsxbd_avx2(auVar100);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar119 = vpmovsxbd_avx2(auVar226);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar121 = vcvtdq2ps_avx(auVar119);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar93 + 6);
  auVar111 = vpmovsxbd_avx2(auVar6);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar96 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar96 + 6);
  auVar113 = vpmovsxbd_avx2(auVar7);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar96 + uVar93 + 6);
  auVar114 = vpmovsxbd_avx2(auVar8);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar89 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar109 = vpmovsxbd_avx2(auVar101);
  auVar120 = vcvtdq2ps_avx(auVar109);
  auVar217._4_4_ = fVar158;
  auVar217._0_4_ = fVar158;
  auVar217._8_4_ = fVar158;
  auVar217._12_4_ = fVar158;
  auVar217._16_4_ = fVar158;
  auVar217._20_4_ = fVar158;
  auVar217._24_4_ = fVar158;
  auVar217._28_4_ = fVar158;
  auVar219._8_4_ = 1;
  auVar219._0_8_ = 0x100000001;
  auVar219._12_4_ = 1;
  auVar219._16_4_ = 1;
  auVar219._20_4_ = 1;
  auVar219._24_4_ = 1;
  auVar219._28_4_ = 1;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar116 = ZEXT1632(CONCAT412(fVar189 * auVar104._12_4_,
                                CONCAT48(fVar189 * auVar104._8_4_,
                                         CONCAT44(fVar189 * auVar104._4_4_,fVar158))));
  auVar115 = vpermps_avx2(auVar219,auVar116);
  auVar108 = vpermps_avx512vl(auVar107,auVar116);
  fVar158 = auVar108._0_4_;
  fVar196 = auVar108._4_4_;
  auVar116._4_4_ = fVar196 * auVar122._4_4_;
  auVar116._0_4_ = fVar158 * auVar122._0_4_;
  fVar197 = auVar108._8_4_;
  auVar116._8_4_ = fVar197 * auVar122._8_4_;
  fVar178 = auVar108._12_4_;
  auVar116._12_4_ = fVar178 * auVar122._12_4_;
  fVar188 = auVar108._16_4_;
  auVar116._16_4_ = fVar188 * auVar122._16_4_;
  fVar98 = auVar108._20_4_;
  auVar116._20_4_ = fVar98 * auVar122._20_4_;
  fVar99 = auVar108._24_4_;
  auVar116._24_4_ = fVar99 * auVar122._24_4_;
  auVar116._28_4_ = auVar119._28_4_;
  auVar119._4_4_ = auVar111._4_4_ * fVar196;
  auVar119._0_4_ = auVar111._0_4_ * fVar158;
  auVar119._8_4_ = auVar111._8_4_ * fVar197;
  auVar119._12_4_ = auVar111._12_4_ * fVar178;
  auVar119._16_4_ = auVar111._16_4_ * fVar188;
  auVar119._20_4_ = auVar111._20_4_ * fVar98;
  auVar119._24_4_ = auVar111._24_4_ * fVar99;
  auVar119._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar120._4_4_ * fVar196;
  auVar109._0_4_ = auVar120._0_4_ * fVar158;
  auVar109._8_4_ = auVar120._8_4_ * fVar197;
  auVar109._12_4_ = auVar120._12_4_ * fVar178;
  auVar109._16_4_ = auVar120._16_4_ * fVar188;
  auVar109._20_4_ = auVar120._20_4_ * fVar98;
  auVar109._24_4_ = auVar120._24_4_ * fVar99;
  auVar109._28_4_ = auVar108._28_4_;
  auVar22 = vfmadd231ps_fma(auVar116,auVar115,auVar110);
  auVar103 = vfmadd231ps_fma(auVar119,auVar115,auVar121);
  auVar102 = vfmadd231ps_fma(auVar109,auVar114,auVar115);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar217,auVar112);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar217,auVar123);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar113,auVar217);
  auVar218._4_4_ = fVar177;
  auVar218._0_4_ = fVar177;
  auVar218._8_4_ = fVar177;
  auVar218._12_4_ = fVar177;
  auVar218._16_4_ = fVar177;
  auVar218._20_4_ = fVar177;
  auVar218._24_4_ = fVar177;
  auVar218._28_4_ = fVar177;
  auVar109 = ZEXT1632(CONCAT412(fVar189 * auVar105._12_4_,
                                CONCAT48(fVar189 * auVar105._8_4_,
                                         CONCAT44(fVar189 * auVar105._4_4_,fVar177))));
  auVar119 = vpermps_avx2(auVar219,auVar109);
  auVar109 = vpermps_avx512vl(auVar107,auVar109);
  fVar189 = auVar109._0_4_;
  fVar158 = auVar109._4_4_;
  auVar115._4_4_ = fVar158 * auVar122._4_4_;
  auVar115._0_4_ = fVar189 * auVar122._0_4_;
  fVar196 = auVar109._8_4_;
  auVar115._8_4_ = fVar196 * auVar122._8_4_;
  fVar197 = auVar109._12_4_;
  auVar115._12_4_ = fVar197 * auVar122._12_4_;
  fVar178 = auVar109._16_4_;
  auVar115._16_4_ = fVar178 * auVar122._16_4_;
  fVar188 = auVar109._20_4_;
  auVar115._20_4_ = fVar188 * auVar122._20_4_;
  fVar98 = auVar109._24_4_;
  auVar115._24_4_ = fVar98 * auVar122._24_4_;
  auVar115._28_4_ = 1;
  auVar107._4_4_ = auVar111._4_4_ * fVar158;
  auVar107._0_4_ = auVar111._0_4_ * fVar189;
  auVar107._8_4_ = auVar111._8_4_ * fVar196;
  auVar107._12_4_ = auVar111._12_4_ * fVar197;
  auVar107._16_4_ = auVar111._16_4_ * fVar178;
  auVar107._20_4_ = auVar111._20_4_ * fVar188;
  auVar107._24_4_ = auVar111._24_4_ * fVar98;
  auVar107._28_4_ = auVar122._28_4_;
  auVar111._4_4_ = auVar120._4_4_ * fVar158;
  auVar111._0_4_ = auVar120._0_4_ * fVar189;
  auVar111._8_4_ = auVar120._8_4_ * fVar196;
  auVar111._12_4_ = auVar120._12_4_ * fVar197;
  auVar111._16_4_ = auVar120._16_4_ * fVar178;
  auVar111._20_4_ = auVar120._20_4_ * fVar188;
  auVar111._24_4_ = auVar120._24_4_ * fVar98;
  auVar111._28_4_ = auVar109._28_4_;
  auVar100 = vfmadd231ps_fma(auVar115,auVar119,auVar110);
  auVar226 = vfmadd231ps_fma(auVar107,auVar119,auVar121);
  auVar6 = vfmadd231ps_fma(auVar111,auVar119,auVar114);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar218,auVar112);
  auVar226 = vfmadd231ps_fma(ZEXT1632(auVar226),auVar218,auVar123);
  auVar209._8_4_ = 0x7fffffff;
  auVar209._0_8_ = 0x7fffffff7fffffff;
  auVar209._12_4_ = 0x7fffffff;
  auVar209._16_4_ = 0x7fffffff;
  auVar209._20_4_ = 0x7fffffff;
  auVar209._24_4_ = 0x7fffffff;
  auVar209._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar218,auVar113);
  auVar112 = vandps_avx(ZEXT1632(auVar22),auVar209);
  auVar206._8_4_ = 0x219392ef;
  auVar206._0_8_ = 0x219392ef219392ef;
  auVar206._12_4_ = 0x219392ef;
  auVar206._16_4_ = 0x219392ef;
  auVar206._20_4_ = 0x219392ef;
  auVar206._24_4_ = 0x219392ef;
  auVar206._28_4_ = 0x219392ef;
  uVar96 = vcmpps_avx512vl(auVar112,auVar206,1);
  bVar15 = (bool)((byte)uVar96 & 1);
  auVar108._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._0_4_;
  bVar15 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._4_4_;
  bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._8_4_;
  bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar103),auVar209);
  uVar96 = vcmpps_avx512vl(auVar112,auVar206,1);
  bVar15 = (bool)((byte)uVar96 & 1);
  auVar117._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar103._0_4_;
  bVar15 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar103._4_4_;
  bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar103._8_4_;
  bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar103._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar102),auVar209);
  uVar96 = vcmpps_avx512vl(auVar112,auVar206,1);
  bVar15 = (bool)((byte)uVar96 & 1);
  auVar112._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._0_4_;
  bVar15 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._4_4_;
  bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._8_4_;
  bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar207._8_4_ = 0x3f800000;
  auVar207._0_8_ = &DAT_3f8000003f800000;
  auVar207._12_4_ = 0x3f800000;
  auVar207._16_4_ = 0x3f800000;
  auVar207._20_4_ = 0x3f800000;
  auVar207._24_4_ = 0x3f800000;
  auVar207._28_4_ = 0x3f800000;
  auVar22 = vfnmadd213ps_fma(auVar108,auVar110,auVar207);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar117);
  auVar103 = vfnmadd213ps_fma(auVar117,auVar110,auVar207);
  auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar112);
  auVar102 = vfnmadd213ps_fma(auVar112,auVar110,auVar207);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar110,auVar110);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar100));
  auVar113._4_4_ = auVar22._4_4_ * auVar112._4_4_;
  auVar113._0_4_ = auVar22._0_4_ * auVar112._0_4_;
  auVar113._8_4_ = auVar22._8_4_ * auVar112._8_4_;
  auVar113._12_4_ = auVar22._12_4_ * auVar112._12_4_;
  auVar113._16_4_ = auVar112._16_4_ * 0.0;
  auVar113._20_4_ = auVar112._20_4_ * 0.0;
  auVar113._24_4_ = auVar112._24_4_ * 0.0;
  auVar113._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar100));
  auVar111 = vpbroadcastd_avx512vl();
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar136._0_4_ = auVar22._0_4_ * auVar112._0_4_;
  auVar136._4_4_ = auVar22._4_4_ * auVar112._4_4_;
  auVar136._8_4_ = auVar22._8_4_ * auVar112._8_4_;
  auVar136._12_4_ = auVar22._12_4_ * auVar112._12_4_;
  auVar136._16_4_ = auVar112._16_4_ * 0.0;
  auVar136._20_4_ = auVar112._20_4_ * 0.0;
  auVar136._24_4_ = auVar112._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar93 * -2 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar226));
  auVar114._4_4_ = auVar103._4_4_ * auVar112._4_4_;
  auVar114._0_4_ = auVar103._0_4_ * auVar112._0_4_;
  auVar114._8_4_ = auVar103._8_4_ * auVar112._8_4_;
  auVar114._12_4_ = auVar103._12_4_ * auVar112._12_4_;
  auVar114._16_4_ = auVar112._16_4_ * 0.0;
  auVar114._20_4_ = auVar112._20_4_ * 0.0;
  auVar114._24_4_ = auVar112._24_4_ * 0.0;
  auVar114._28_4_ = auVar112._28_4_;
  auVar208 = ZEXT3264(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar110);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar226));
  auVar135._0_4_ = auVar103._0_4_ * auVar112._0_4_;
  auVar135._4_4_ = auVar103._4_4_ * auVar112._4_4_;
  auVar135._8_4_ = auVar103._8_4_ * auVar112._8_4_;
  auVar135._12_4_ = auVar103._12_4_ * auVar112._12_4_;
  auVar135._16_4_ = auVar112._16_4_ * 0.0;
  auVar135._20_4_ = auVar112._20_4_ * 0.0;
  auVar135._24_4_ = auVar112._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + uVar93 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar120._4_4_ = auVar112._4_4_ * auVar102._4_4_;
  auVar120._0_4_ = auVar112._0_4_ * auVar102._0_4_;
  auVar120._8_4_ = auVar112._8_4_ * auVar102._8_4_;
  auVar120._12_4_ = auVar112._12_4_ * auVar102._12_4_;
  auVar120._16_4_ = auVar112._16_4_ * 0.0;
  auVar120._20_4_ = auVar112._20_4_ * 0.0;
  auVar120._24_4_ = auVar112._24_4_ * 0.0;
  auVar120._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x17 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar118._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar118._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar118._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar118._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar118._16_4_ = auVar112._16_4_ * 0.0;
  auVar118._20_4_ = auVar112._20_4_ * 0.0;
  auVar118._24_4_ = auVar112._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar112 = vpminsd_avx2(auVar113,auVar136);
  auVar110 = vpminsd_avx2(auVar114,auVar135);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110 = vpminsd_avx2(auVar120,auVar118);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar122._4_4_ = uVar3;
  auVar122._0_4_ = uVar3;
  auVar122._8_4_ = uVar3;
  auVar122._12_4_ = uVar3;
  auVar122._16_4_ = uVar3;
  auVar122._20_4_ = uVar3;
  auVar122._24_4_ = uVar3;
  auVar122._28_4_ = uVar3;
  auVar110 = vmaxps_avx512vl(auVar110,auVar122);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar112,auVar110);
  auVar187 = ZEXT3264(local_80);
  auVar112 = vpmaxsd_avx2(auVar113,auVar136);
  auVar110 = vpmaxsd_avx2(auVar114,auVar135);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar110 = vpmaxsd_avx2(auVar120,auVar118);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar123._4_4_ = uVar3;
  auVar123._0_4_ = uVar3;
  auVar123._8_4_ = uVar3;
  auVar123._12_4_ = uVar3;
  auVar123._16_4_ = uVar3;
  auVar123._20_4_ = uVar3;
  auVar123._24_4_ = uVar3;
  auVar123._28_4_ = uVar3;
  auVar110 = vminps_avx512vl(auVar110,auVar123);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar121._8_4_ = 0x3f800003;
  auVar121._0_8_ = 0x3f8000033f800003;
  auVar121._12_4_ = 0x3f800003;
  auVar121._16_4_ = 0x3f800003;
  auVar121._20_4_ = 0x3f800003;
  auVar121._24_4_ = 0x3f800003;
  auVar121._28_4_ = 0x3f800003;
  auVar112 = vmulps_avx512vl(auVar112,auVar121);
  uVar23 = vpcmpgtd_avx512vl(auVar111,_DAT_0205a920);
  uVar160 = vcmpps_avx512vl(local_80,auVar112,2);
  if ((byte)((byte)uVar160 & (byte)uVar23) != 0) {
    uVar96 = (ulong)(byte)((byte)uVar160 & (byte)uVar23);
    local_708 = (undefined1 (*) [32])&local_200;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar110 = auVar208._0_32_;
      auVar112 = auVar187._0_32_;
      local_660 = in_ZMM21._0_32_;
      local_640 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar89 = uVar96; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar96 = uVar96 - 1 & uVar96;
      uVar3 = *(undefined4 *)(prim + lVar24 * 4 + 6);
      uVar89 = (ulong)(uint)((int)lVar24 << 6);
      uVar95 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar95].ptr;
      auVar22 = *(undefined1 (*) [16])(prim + uVar89 + lVar72 + 0x16);
      if (uVar96 != 0) {
        uVar92 = uVar96 - 1 & uVar96;
        for (uVar93 = uVar96; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        }
        if (uVar92 != 0) {
          for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_6b0 = *(undefined1 (*) [16])(prim + uVar89 + lVar72 + 0x26);
      local_6c0 = *(undefined1 (*) [16])(prim + uVar89 + lVar72 + 0x36);
      _local_6d0 = *(undefined1 (*) [16])(prim + uVar89 + lVar72 + 0x46);
      local_5a0 = (uint)pGVar12;
      uStack_59c = (uint)((ulong)pGVar12 >> 0x20);
      iVar10 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar100 = vsubps_avx512vl(auVar22,auVar103);
      uVar159 = auVar100._0_4_;
      auVar104._4_4_ = uVar159;
      auVar104._0_4_ = uVar159;
      auVar104._8_4_ = uVar159;
      auVar104._12_4_ = uVar159;
      auVar102 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar189 = pre->ray_space[k].vz.field_0.m128[0];
      fVar158 = pre->ray_space[k].vz.field_0.m128[1];
      fVar196 = pre->ray_space[k].vz.field_0.m128[2];
      fVar197 = pre->ray_space[k].vz.field_0.m128[3];
      auVar212._0_4_ = fVar189 * auVar100._0_4_;
      auVar212._4_4_ = fVar158 * auVar100._4_4_;
      auVar212._8_4_ = fVar196 * auVar100._8_4_;
      auVar212._12_4_ = fVar197 * auVar100._12_4_;
      auVar102 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar102);
      auVar226 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar104);
      auVar101 = vshufps_avx512vl(auVar22,auVar22,0xff);
      auVar100 = vsubps_avx(local_6b0,auVar103);
      uVar159 = auVar100._0_4_;
      auVar179._4_4_ = uVar159;
      auVar179._0_4_ = uVar159;
      auVar179._8_4_ = uVar159;
      auVar179._12_4_ = uVar159;
      auVar102 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar106._0_4_ = fVar189 * auVar100._0_4_;
      auVar106._4_4_ = fVar158 * auVar100._4_4_;
      auVar106._8_4_ = fVar196 * auVar100._8_4_;
      auVar106._12_4_ = fVar197 * auVar100._12_4_;
      auVar102 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar102);
      auVar6 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar179);
      auVar100 = vsubps_avx512vl(local_6c0,auVar103);
      uVar159 = auVar100._0_4_;
      auVar180._4_4_ = uVar159;
      auVar180._0_4_ = uVar159;
      auVar180._8_4_ = uVar159;
      auVar180._12_4_ = uVar159;
      auVar102 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar214._0_4_ = fVar189 * auVar100._0_4_;
      auVar214._4_4_ = fVar158 * auVar100._4_4_;
      auVar214._8_4_ = fVar196 * auVar100._8_4_;
      auVar214._12_4_ = fVar197 * auVar100._12_4_;
      auVar102 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar5,auVar102);
      auVar100 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar180);
      auVar102 = vsubps_avx512vl(_local_6d0,auVar103);
      uVar159 = auVar102._0_4_;
      auVar105._4_4_ = uVar159;
      auVar105._0_4_ = uVar159;
      auVar105._8_4_ = uVar159;
      auVar105._12_4_ = uVar159;
      auVar103 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar215._0_4_ = fVar189 * auVar102._0_4_;
      auVar215._4_4_ = fVar158 * auVar102._4_4_;
      auVar215._8_4_ = fVar196 * auVar102._8_4_;
      auVar215._12_4_ = fVar197 * auVar102._12_4_;
      auVar103 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar5,auVar103);
      auVar7 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar105);
      lVar24 = (long)iVar10 * 0x44;
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      uVar159 = auVar226._0_4_;
      local_540._4_4_ = uVar159;
      local_540._0_4_ = uVar159;
      local_540._8_4_ = uVar159;
      local_540._12_4_ = uVar159;
      local_540._16_4_ = uVar159;
      local_540._20_4_ = uVar159;
      local_540._24_4_ = uVar159;
      local_540._28_4_ = uVar159;
      auVar172._8_4_ = 1;
      auVar172._0_8_ = 0x100000001;
      auVar172._12_4_ = 1;
      auVar172._16_4_ = 1;
      auVar172._20_4_ = 1;
      auVar172._24_4_ = 1;
      auVar172._28_4_ = 1;
      local_560 = vpermps_avx512vl(auVar172,ZEXT1632(auVar226));
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      local_700 = vbroadcastss_avx512vl(auVar6);
      local_340 = vpermps_avx2(auVar172,ZEXT1632(auVar6));
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar100);
      local_c0 = vpermps_avx512vl(auVar172,ZEXT1632(auVar100));
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0xd8c);
      local_680 = vbroadcastss_avx512vl(auVar7);
      auVar228 = ZEXT3264(local_680);
      local_6a0 = vpermps_avx512vl(auVar172,ZEXT1632(auVar7));
      auVar229 = ZEXT3264(local_6a0);
      auVar113 = vmulps_avx512vl(local_680,auVar111);
      auVar114 = vmulps_avx512vl(local_6a0,auVar111);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar121,local_a0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,local_c0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_700);
      auVar103 = vfmadd231ps_fma(auVar114,auVar123,local_340);
      auVar109 = vfmadd231ps_avx512vl(auVar113,auVar122,local_540);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar122,local_560);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      auVar116 = vmulps_avx512vl(local_680,auVar119);
      auVar107 = vmulps_avx512vl(local_6a0,auVar119);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,local_a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,local_c0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,local_700);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_340);
      auVar8 = vfmadd231ps_fma(auVar116,auVar113,local_540);
      auVar116 = vfmadd231ps_avx512vl(auVar107,auVar113,local_560);
      local_520 = vsubps_avx512vl(ZEXT1632(auVar8),auVar109);
      local_580 = vsubps_avx(auVar116,auVar115);
      auVar107 = vmulps_avx512vl(auVar115,local_520);
      auVar108 = vmulps_avx512vl(auVar109,local_580);
      auVar107 = vsubps_avx512vl(auVar107,auVar108);
      auVar103 = vshufps_avx(local_6b0,local_6b0,0xff);
      uVar160 = auVar101._0_8_;
      local_e0._8_8_ = uVar160;
      local_e0._0_8_ = uVar160;
      local_e0._16_8_ = uVar160;
      local_e0._24_8_ = uVar160;
      local_100 = vbroadcastsd_avx512vl(auVar103);
      auVar103 = vshufps_avx512vl(local_6c0,local_6c0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar103);
      auVar103 = vshufps_avx512vl(_local_6d0,_local_6d0,0xff);
      uVar160 = auVar103._0_8_;
      register0x00001248 = uVar160;
      local_140 = uVar160;
      register0x00001250 = uVar160;
      register0x00001258 = uVar160;
      auVar108 = vmulps_avx512vl(_local_140,auVar111);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_120);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,local_100);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar122,local_e0);
      auVar117 = vmulps_avx512vl(_local_140,auVar119);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar120,local_120);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,local_100);
      auVar101 = vfmadd231ps_fma(auVar117,auVar113,local_e0);
      auVar117 = vmulps_avx512vl(local_580,local_580);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_520,local_520);
      auVar118 = vmaxps_avx512vl(auVar108,ZEXT1632(auVar101));
      auVar118 = vmulps_avx512vl(auVar118,auVar118);
      auVar117 = vmulps_avx512vl(auVar118,auVar117);
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      uVar160 = vcmpps_avx512vl(auVar107,auVar117,2);
      auVar103 = vblendps_avx(auVar226,auVar22,8);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar102 = vandps_avx512vl(auVar103,auVar104);
      auVar103 = vblendps_avx(auVar6,local_6b0,8);
      auVar103 = vandps_avx512vl(auVar103,auVar104);
      auVar102 = vmaxps_avx(auVar102,auVar103);
      auVar103 = vblendps_avx(auVar100,local_6c0,8);
      auVar105 = vandps_avx512vl(auVar103,auVar104);
      auVar103 = vblendps_avx(auVar7,_local_6d0,8);
      auVar103 = vandps_avx512vl(auVar103,auVar104);
      auVar103 = vmaxps_avx(auVar105,auVar103);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vmovshdup_avx(auVar103);
      auVar102 = vmaxss_avx(auVar102,auVar103);
      auVar103 = vshufpd_avx(auVar103,auVar103,1);
      auVar103 = vmaxss_avx(auVar103,auVar102);
      auVar102 = vcvtsi2ss_avx512f(_local_6d0,iVar10);
      local_500._0_16_ = auVar102;
      auVar216._0_4_ = auVar102._0_4_;
      auVar216._4_4_ = auVar216._0_4_;
      auVar216._8_4_ = auVar216._0_4_;
      auVar216._12_4_ = auVar216._0_4_;
      auVar216._16_4_ = auVar216._0_4_;
      auVar216._20_4_ = auVar216._0_4_;
      auVar216._24_4_ = auVar216._0_4_;
      auVar216._28_4_ = auVar216._0_4_;
      uVar23 = vcmpps_avx512vl(auVar216,_DAT_02020f40,0xe);
      bVar97 = (byte)uVar160 & (byte)uVar23;
      auVar103 = vmulss_avx512f(auVar103,ZEXT416(0x35000000));
      auVar185._8_4_ = 2;
      auVar185._0_8_ = 0x200000002;
      auVar185._12_4_ = 2;
      auVar185._16_4_ = 2;
      auVar185._20_4_ = 2;
      auVar185._24_4_ = 2;
      auVar185._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar185,ZEXT1632(auVar226));
      local_180 = vpermps_avx512vl(auVar185,ZEXT1632(auVar6));
      local_1a0 = vpermps_avx512vl(auVar185,ZEXT1632(auVar100));
      local_1c0 = vpermps_avx2(auVar185,ZEXT1632(auVar7));
      uVar211 = *(uint *)(ray + k * 4 + 0x60);
      auVar102 = local_520._0_16_;
      if (bVar97 == 0) {
        auVar102 = vxorps_avx512vl(auVar102,auVar102);
        auVar227 = ZEXT1664(auVar102);
        auVar208 = ZEXT3264(auVar110);
        in_ZMM20 = ZEXT3264(local_640);
        auVar187 = ZEXT3264(auVar112);
        in_ZMM21 = ZEXT3264(local_660);
        auVar225 = ZEXT3264(local_540);
        auVar223 = ZEXT3264(local_560);
        auVar222 = ZEXT3264(local_700);
      }
      else {
        _local_5c0 = ZEXT416(uVar211);
        auVar119 = vmulps_avx512vl(local_1c0,auVar119);
        auVar120 = vfmadd213ps_avx512vl(auVar120,local_1a0,auVar119);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_180,auVar120);
        auVar114 = vfmadd213ps_avx512vl(auVar113,local_160,auVar114);
        auVar111 = vmulps_avx512vl(local_1c0,auVar111);
        auVar121 = vfmadd213ps_avx512vl(auVar121,local_1a0,auVar111);
        auVar120 = vfmadd213ps_avx512vl(auVar123,local_180,auVar121);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1f9c);
        auVar120 = vfmadd213ps_avx512vl(auVar122,local_160,auVar120);
        auVar122 = vmulps_avx512vl(local_680,auVar113);
        auVar119 = vmulps_avx512vl(local_6a0,auVar113);
        auVar113 = vmulps_avx512vl(local_1c0,auVar113);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,local_a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar111,local_c0);
        auVar111 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar111);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar121,local_700);
        auVar100 = vfmadd231ps_fma(auVar119,auVar121,local_340);
        auVar113 = vfmadd231ps_avx512vl(auVar111,local_180,auVar121);
        auVar119 = vfmadd231ps_avx512vl(auVar122,auVar123,local_540);
        auVar223 = ZEXT3264(local_560);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar123,local_560);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_160,auVar123);
        auVar123 = vmulps_avx512vl(local_680,auVar111);
        auVar117 = vmulps_avx512vl(local_6a0,auVar111);
        auVar111 = vmulps_avx512vl(local_1c0,auVar111);
        auVar118 = vfmadd231ps_avx512vl(auVar123,auVar121,local_a0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar121,local_c0);
        auVar121 = vfmadd231ps_avx512vl(auVar111,local_1a0,auVar121);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar111 = vfmadd231ps_avx512vl(auVar118,auVar123,local_700);
        auVar100 = vfmadd231ps_fma(auVar117,auVar123,local_340);
        auVar123 = vfmadd231ps_avx512vl(auVar121,local_180,auVar123);
        auVar121 = vfmadd231ps_avx512vl(auVar111,auVar122,local_540);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar122,local_560);
        auVar117 = vfmadd231ps_avx512vl(auVar123,local_160,auVar122);
        auVar220._8_4_ = 0x7fffffff;
        auVar220._0_8_ = 0x7fffffff7fffffff;
        auVar220._12_4_ = 0x7fffffff;
        auVar220._16_4_ = 0x7fffffff;
        auVar220._20_4_ = 0x7fffffff;
        auVar220._24_4_ = 0x7fffffff;
        auVar220._28_4_ = 0x7fffffff;
        auVar122 = vandps_avx(auVar119,auVar220);
        auVar123 = vandps_avx(auVar107,auVar220);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar113,auVar220);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        auVar113 = vbroadcastss_avx512vl(auVar103);
        uVar89 = vcmpps_avx512vl(auVar122,auVar113,1);
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar124._0_4_ = (float)((uint)bVar15 * local_520._0_4_ | (uint)!bVar15 * auVar119._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar15 * local_520._4_4_ | (uint)!bVar15 * auVar119._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar15 * local_520._8_4_ | (uint)!bVar15 * auVar119._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar15 * local_520._12_4_ | (uint)!bVar15 * auVar119._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar15 * local_520._16_4_ | (uint)!bVar15 * auVar119._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar15 * local_520._20_4_ | (uint)!bVar15 * auVar119._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar15 * local_520._24_4_ | (uint)!bVar15 * auVar119._24_4_)
        ;
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar124._28_4_ = (uint)bVar15 * local_520._28_4_ | (uint)!bVar15 * auVar119._28_4_;
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar125._0_4_ = (float)((uint)bVar15 * local_580._0_4_ | (uint)!bVar15 * auVar107._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar15 * local_580._4_4_ | (uint)!bVar15 * auVar107._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar15 * local_580._8_4_ | (uint)!bVar15 * auVar107._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar15 * local_580._12_4_ | (uint)!bVar15 * auVar107._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar15 * local_580._16_4_ | (uint)!bVar15 * auVar107._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar15 * local_580._20_4_ | (uint)!bVar15 * auVar107._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar15 * local_580._24_4_ | (uint)!bVar15 * auVar107._24_4_)
        ;
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar125._28_4_ = (uint)bVar15 * local_580._28_4_ | (uint)!bVar15 * auVar107._28_4_;
        auVar122 = vandps_avx(auVar220,auVar121);
        auVar123 = vandps_avx(auVar111,auVar220);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar117,auVar220);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        uVar89 = vcmpps_avx512vl(auVar122,auVar113,1);
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar126._0_4_ = (float)((uint)bVar15 * local_520._0_4_ | (uint)!bVar15 * auVar121._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar15 * local_520._4_4_ | (uint)!bVar15 * auVar121._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar15 * local_520._8_4_ | (uint)!bVar15 * auVar121._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar15 * local_520._12_4_ | (uint)!bVar15 * auVar121._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar15 * local_520._16_4_ | (uint)!bVar15 * auVar121._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar15 * local_520._20_4_ | (uint)!bVar15 * auVar121._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar15 * local_520._24_4_ | (uint)!bVar15 * auVar121._24_4_)
        ;
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = (uint)bVar15 * local_520._28_4_ | (uint)!bVar15 * auVar121._28_4_;
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar127._0_4_ = (float)((uint)bVar15 * local_580._0_4_ | (uint)!bVar15 * auVar111._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar15 * local_580._4_4_ | (uint)!bVar15 * auVar111._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar15 * local_580._8_4_ | (uint)!bVar15 * auVar111._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar15 * local_580._12_4_ | (uint)!bVar15 * auVar111._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar15 * local_580._16_4_ | (uint)!bVar15 * auVar111._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar15 * local_580._20_4_ | (uint)!bVar15 * auVar111._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar15 * local_580._24_4_ | (uint)!bVar15 * auVar111._24_4_)
        ;
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar127._28_4_ = (uint)bVar15 * local_580._28_4_ | (uint)!bVar15 * auVar111._28_4_;
        auVar106 = vxorps_avx512vl(auVar102,auVar102);
        auVar227 = ZEXT1664(auVar106);
        auVar122 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar106));
        auVar102 = vfmadd231ps_fma(auVar122,auVar125,auVar125);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        fVar189 = auVar122._0_4_;
        fVar158 = auVar122._4_4_;
        fVar196 = auVar122._8_4_;
        fVar197 = auVar122._12_4_;
        fVar178 = auVar122._16_4_;
        fVar188 = auVar122._20_4_;
        fVar98 = auVar122._24_4_;
        auVar36._4_4_ = fVar158 * fVar158 * fVar158 * auVar102._4_4_ * -0.5;
        auVar36._0_4_ = fVar189 * fVar189 * fVar189 * auVar102._0_4_ * -0.5;
        auVar36._8_4_ = fVar196 * fVar196 * fVar196 * auVar102._8_4_ * -0.5;
        auVar36._12_4_ = fVar197 * fVar197 * fVar197 * auVar102._12_4_ * -0.5;
        auVar36._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar36._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar36._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar36._28_4_ = 0;
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar121 = vfmadd231ps_avx512vl(auVar36,auVar123,auVar122);
        auVar37._4_4_ = auVar125._4_4_ * auVar121._4_4_;
        auVar37._0_4_ = auVar125._0_4_ * auVar121._0_4_;
        auVar37._8_4_ = auVar125._8_4_ * auVar121._8_4_;
        auVar37._12_4_ = auVar125._12_4_ * auVar121._12_4_;
        auVar37._16_4_ = auVar125._16_4_ * auVar121._16_4_;
        auVar37._20_4_ = auVar125._20_4_ * auVar121._20_4_;
        auVar37._24_4_ = auVar125._24_4_ * auVar121._24_4_;
        auVar37._28_4_ = auVar122._28_4_;
        auVar38._4_4_ = auVar121._4_4_ * -auVar124._4_4_;
        auVar38._0_4_ = auVar121._0_4_ * -auVar124._0_4_;
        auVar38._8_4_ = auVar121._8_4_ * -auVar124._8_4_;
        auVar38._12_4_ = auVar121._12_4_ * -auVar124._12_4_;
        auVar38._16_4_ = auVar121._16_4_ * -auVar124._16_4_;
        auVar38._20_4_ = auVar121._20_4_ * -auVar124._20_4_;
        auVar38._24_4_ = auVar121._24_4_ * -auVar124._24_4_;
        auVar38._28_4_ = auVar124._28_4_ ^ 0x80000000;
        auVar122 = vmulps_avx512vl(auVar121,ZEXT1632(auVar106));
        auVar107 = ZEXT1632(auVar106);
        auVar111 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar107);
        auVar102 = vfmadd231ps_fma(auVar111,auVar127,auVar127);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        fVar189 = auVar111._0_4_;
        fVar158 = auVar111._4_4_;
        fVar196 = auVar111._8_4_;
        fVar197 = auVar111._12_4_;
        fVar178 = auVar111._16_4_;
        fVar188 = auVar111._20_4_;
        fVar98 = auVar111._24_4_;
        auVar39._4_4_ = fVar158 * fVar158 * fVar158 * auVar102._4_4_ * -0.5;
        auVar39._0_4_ = fVar189 * fVar189 * fVar189 * auVar102._0_4_ * -0.5;
        auVar39._8_4_ = fVar196 * fVar196 * fVar196 * auVar102._8_4_ * -0.5;
        auVar39._12_4_ = fVar197 * fVar197 * fVar197 * auVar102._12_4_ * -0.5;
        auVar39._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar39._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar39._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar39._28_4_ = 0;
        auVar123 = vfmadd231ps_avx512vl(auVar39,auVar123,auVar111);
        auVar40._4_4_ = auVar127._4_4_ * auVar123._4_4_;
        auVar40._0_4_ = auVar127._0_4_ * auVar123._0_4_;
        auVar40._8_4_ = auVar127._8_4_ * auVar123._8_4_;
        auVar40._12_4_ = auVar127._12_4_ * auVar123._12_4_;
        auVar40._16_4_ = auVar127._16_4_ * auVar123._16_4_;
        auVar40._20_4_ = auVar127._20_4_ * auVar123._20_4_;
        auVar40._24_4_ = auVar127._24_4_ * auVar123._24_4_;
        auVar40._28_4_ = auVar111._28_4_;
        auVar41._4_4_ = -auVar126._4_4_ * auVar123._4_4_;
        auVar41._0_4_ = -auVar126._0_4_ * auVar123._0_4_;
        auVar41._8_4_ = -auVar126._8_4_ * auVar123._8_4_;
        auVar41._12_4_ = -auVar126._12_4_ * auVar123._12_4_;
        auVar41._16_4_ = -auVar126._16_4_ * auVar123._16_4_;
        auVar41._20_4_ = -auVar126._20_4_ * auVar123._20_4_;
        auVar41._24_4_ = -auVar126._24_4_ * auVar123._24_4_;
        auVar41._28_4_ = auVar121._28_4_;
        auVar123 = vmulps_avx512vl(auVar123,auVar107);
        auVar102 = vfmadd213ps_fma(auVar37,auVar108,auVar109);
        auVar100 = vfmadd213ps_fma(auVar38,auVar108,auVar115);
        auVar121 = vfmadd213ps_avx512vl(auVar122,auVar108,auVar120);
        auVar111 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar101),ZEXT1632(auVar8));
        auVar104 = vfnmadd213ps_fma(auVar37,auVar108,auVar109);
        auVar119 = ZEXT1632(auVar101);
        auVar226 = vfmadd213ps_fma(auVar41,auVar119,auVar116);
        auVar105 = vfnmadd213ps_fma(auVar38,auVar108,auVar115);
        auVar6 = vfmadd213ps_fma(auVar123,auVar119,auVar114);
        auVar113 = vfnmadd231ps_avx512vl(auVar120,auVar108,auVar122);
        auVar179 = vfnmadd213ps_fma(auVar40,auVar119,ZEXT1632(auVar8));
        auVar180 = vfnmadd213ps_fma(auVar41,auVar119,auVar116);
        auVar212 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar101),auVar123);
        auVar123 = vsubps_avx512vl(auVar111,ZEXT1632(auVar104));
        auVar122 = vsubps_avx(ZEXT1632(auVar226),ZEXT1632(auVar105));
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar6),auVar113);
        auVar120 = vmulps_avx512vl(auVar122,auVar113);
        auVar7 = vfmsub231ps_fma(auVar120,ZEXT1632(auVar105),auVar114);
        auVar42._4_4_ = auVar104._4_4_ * auVar114._4_4_;
        auVar42._0_4_ = auVar104._0_4_ * auVar114._0_4_;
        auVar42._8_4_ = auVar104._8_4_ * auVar114._8_4_;
        auVar42._12_4_ = auVar104._12_4_ * auVar114._12_4_;
        auVar42._16_4_ = auVar114._16_4_ * 0.0;
        auVar42._20_4_ = auVar114._20_4_ * 0.0;
        auVar42._24_4_ = auVar114._24_4_ * 0.0;
        auVar42._28_4_ = auVar114._28_4_;
        auVar114 = vfmsub231ps_avx512vl(auVar42,auVar113,auVar123);
        auVar43._4_4_ = auVar105._4_4_ * auVar123._4_4_;
        auVar43._0_4_ = auVar105._0_4_ * auVar123._0_4_;
        auVar43._8_4_ = auVar105._8_4_ * auVar123._8_4_;
        auVar43._12_4_ = auVar105._12_4_ * auVar123._12_4_;
        auVar43._16_4_ = auVar123._16_4_ * 0.0;
        auVar43._20_4_ = auVar123._20_4_ * 0.0;
        auVar43._24_4_ = auVar123._24_4_ * 0.0;
        auVar43._28_4_ = auVar123._28_4_;
        auVar8 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar104),auVar122);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar107,auVar114);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar107,ZEXT1632(auVar7));
        auVar107 = ZEXT1632(auVar106);
        uVar89 = vcmpps_avx512vl(auVar122,auVar107,2);
        bVar88 = (byte)uVar89;
        fVar98 = (float)((uint)(bVar88 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar179._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar177 = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar179._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar151 = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar179._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar154 = (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar179._12_4_);
        auVar120 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar151,CONCAT44(fVar177,fVar98))));
        fVar99 = (float)((uint)(bVar88 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar180._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar150 = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar180._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar152 = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar180._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar155 = (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar180._12_4_);
        auVar119 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar150,fVar99))));
        auVar128._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar121._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar212._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar212._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar212._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar212._12_4_);
        fVar158 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_);
        auVar128._16_4_ = fVar158;
        fVar189 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_);
        auVar128._20_4_ = fVar189;
        fVar196 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_);
        auVar128._24_4_ = fVar196;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar121._28_4_;
        auVar128._28_4_ = iVar1;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar104),auVar111);
        auVar129._0_4_ =
             (uint)(bVar88 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar7._0_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar7._4_4_;
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar7._8_4_;
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar7._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_;
        auVar129._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar226));
        auVar130._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar100._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar100._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar100._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar100._12_4_);
        fVar188 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_);
        auVar130._16_4_ = fVar188;
        fVar178 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_);
        auVar130._20_4_ = fVar178;
        fVar197 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_);
        auVar130._24_4_ = fVar197;
        auVar130._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(auVar113,ZEXT1632(auVar6));
        auVar131._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar121._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar121._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar121._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar121._12_4_);
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar15 * auVar123._16_4_ | (uint)!bVar15 * auVar121._16_4_);
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar15 * auVar123._20_4_ | (uint)!bVar15 * auVar121._20_4_);
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar15 * auVar123._24_4_ | (uint)!bVar15 * auVar121._24_4_);
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar131._28_4_ = (uint)bVar15 * auVar123._28_4_ | (uint)!bVar15 * auVar121._28_4_;
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar104._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar111._0_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar15 * (int)auVar104._4_4_ | (uint)!bVar15 * auVar111._4_4_;
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar15 * (int)auVar104._8_4_ | (uint)!bVar15 * auVar111._8_4_;
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar15 * (int)auVar104._12_4_ | (uint)!bVar15 * auVar111._12_4_;
        auVar132._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar111._16_4_;
        auVar132._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar111._20_4_;
        auVar132._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar111._24_4_;
        auVar132._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar111._28_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._0_4_ =
             (uint)(bVar88 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar133._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar113._16_4_;
        auVar133._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar113._20_4_;
        auVar133._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar113._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar113._28_4_;
        auVar133._28_4_ = iVar2;
        auVar109 = vsubps_avx512vl(auVar132,auVar120);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar105._12_4_ |
                                                 (uint)!bVar18 * auVar226._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar105._8_4_ |
                                                          (uint)!bVar17 * auVar226._8_4_,
                                                          CONCAT44((uint)bVar15 *
                                                                   (int)auVar105._4_4_ |
                                                                   (uint)!bVar15 * auVar226._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar105._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar226._0_4_)))),auVar119);
        auVar121 = vsubps_avx(auVar133,auVar128);
        auVar111 = vsubps_avx(auVar120,auVar129);
        auVar113 = vsubps_avx(auVar119,auVar130);
        auVar114 = vsubps_avx(auVar128,auVar131);
        auVar44._4_4_ = auVar121._4_4_ * fVar177;
        auVar44._0_4_ = auVar121._0_4_ * fVar98;
        auVar44._8_4_ = auVar121._8_4_ * fVar151;
        auVar44._12_4_ = auVar121._12_4_ * fVar154;
        auVar44._16_4_ = auVar121._16_4_ * 0.0;
        auVar44._20_4_ = auVar121._20_4_ * 0.0;
        auVar44._24_4_ = auVar121._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar102 = vfmsub231ps_fma(auVar44,auVar128,auVar109);
        auVar45._4_4_ = fVar150 * auVar109._4_4_;
        auVar45._0_4_ = fVar99 * auVar109._0_4_;
        auVar45._8_4_ = fVar152 * auVar109._8_4_;
        auVar45._12_4_ = fVar155 * auVar109._12_4_;
        auVar45._16_4_ = auVar109._16_4_ * 0.0;
        auVar45._20_4_ = auVar109._20_4_ * 0.0;
        auVar45._24_4_ = auVar109._24_4_ * 0.0;
        auVar45._28_4_ = auVar122._28_4_;
        auVar100 = vfmsub231ps_fma(auVar45,auVar120,auVar123);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar107,ZEXT1632(auVar102));
        auVar190._0_4_ = auVar123._0_4_ * auVar128._0_4_;
        auVar190._4_4_ = auVar123._4_4_ * auVar128._4_4_;
        auVar190._8_4_ = auVar123._8_4_ * auVar128._8_4_;
        auVar190._12_4_ = auVar123._12_4_ * auVar128._12_4_;
        auVar190._16_4_ = auVar123._16_4_ * fVar158;
        auVar190._20_4_ = auVar123._20_4_ * fVar189;
        auVar190._24_4_ = auVar123._24_4_ * fVar196;
        auVar190._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar190,auVar119,auVar121);
        auVar115 = vfmadd231ps_avx512vl(auVar122,auVar107,ZEXT1632(auVar102));
        auVar122 = vmulps_avx512vl(auVar114,auVar129);
        auVar122 = vfmsub231ps_avx512vl(auVar122,auVar111,auVar131);
        auVar46._4_4_ = auVar113._4_4_ * auVar131._4_4_;
        auVar46._0_4_ = auVar113._0_4_ * auVar131._0_4_;
        auVar46._8_4_ = auVar113._8_4_ * auVar131._8_4_;
        auVar46._12_4_ = auVar113._12_4_ * auVar131._12_4_;
        auVar46._16_4_ = auVar113._16_4_ * auVar131._16_4_;
        auVar46._20_4_ = auVar113._20_4_ * auVar131._20_4_;
        auVar46._24_4_ = auVar113._24_4_ * auVar131._24_4_;
        auVar46._28_4_ = auVar131._28_4_;
        auVar102 = vfmsub231ps_fma(auVar46,auVar130,auVar114);
        auVar191._0_4_ = auVar130._0_4_ * auVar111._0_4_;
        auVar191._4_4_ = auVar130._4_4_ * auVar111._4_4_;
        auVar191._8_4_ = auVar130._8_4_ * auVar111._8_4_;
        auVar191._12_4_ = auVar130._12_4_ * auVar111._12_4_;
        auVar191._16_4_ = fVar188 * auVar111._16_4_;
        auVar191._20_4_ = fVar178 * auVar111._20_4_;
        auVar191._24_4_ = fVar197 * auVar111._24_4_;
        auVar191._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar191,auVar113,auVar129);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar107,auVar122);
        auVar116 = vfmadd231ps_avx512vl(auVar122,auVar107,ZEXT1632(auVar102));
        auVar122 = vmaxps_avx(auVar115,auVar116);
        uVar160 = vcmpps_avx512vl(auVar122,auVar107,2);
        bVar97 = bVar97 & (byte)uVar160;
        in_ZMM20 = ZEXT3264(local_640);
        in_ZMM21 = ZEXT3264(local_660);
        auVar225 = ZEXT3264(local_540);
        auVar222 = ZEXT3264(local_700);
        if (bVar97 == 0) {
          bVar97 = 0;
          auVar208 = ZEXT3264(auVar110);
          auVar187 = ZEXT3264(auVar112);
        }
        else {
          auVar47._4_4_ = auVar114._4_4_ * auVar123._4_4_;
          auVar47._0_4_ = auVar114._0_4_ * auVar123._0_4_;
          auVar47._8_4_ = auVar114._8_4_ * auVar123._8_4_;
          auVar47._12_4_ = auVar114._12_4_ * auVar123._12_4_;
          auVar47._16_4_ = auVar114._16_4_ * auVar123._16_4_;
          auVar47._20_4_ = auVar114._20_4_ * auVar123._20_4_;
          auVar47._24_4_ = auVar114._24_4_ * auVar123._24_4_;
          auVar47._28_4_ = auVar122._28_4_;
          auVar226 = vfmsub231ps_fma(auVar47,auVar113,auVar121);
          auVar48._4_4_ = auVar121._4_4_ * auVar111._4_4_;
          auVar48._0_4_ = auVar121._0_4_ * auVar111._0_4_;
          auVar48._8_4_ = auVar121._8_4_ * auVar111._8_4_;
          auVar48._12_4_ = auVar121._12_4_ * auVar111._12_4_;
          auVar48._16_4_ = auVar121._16_4_ * auVar111._16_4_;
          auVar48._20_4_ = auVar121._20_4_ * auVar111._20_4_;
          auVar48._24_4_ = auVar121._24_4_ * auVar111._24_4_;
          auVar48._28_4_ = auVar121._28_4_;
          auVar100 = vfmsub231ps_fma(auVar48,auVar109,auVar114);
          auVar49._4_4_ = auVar113._4_4_ * auVar109._4_4_;
          auVar49._0_4_ = auVar113._0_4_ * auVar109._0_4_;
          auVar49._8_4_ = auVar113._8_4_ * auVar109._8_4_;
          auVar49._12_4_ = auVar113._12_4_ * auVar109._12_4_;
          auVar49._16_4_ = auVar113._16_4_ * auVar109._16_4_;
          auVar49._20_4_ = auVar113._20_4_ * auVar109._20_4_;
          auVar49._24_4_ = auVar113._24_4_ * auVar109._24_4_;
          auVar49._28_4_ = auVar113._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar111,auVar123);
          auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar6));
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar226),auVar107);
          auVar123 = vrcp14ps_avx512vl(auVar122);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar121 = vfnmadd213ps_avx512vl(auVar123,auVar122,auVar25);
          auVar102 = vfmadd132ps_fma(auVar121,auVar123,auVar123);
          auVar50._4_4_ = auVar6._4_4_ * auVar128._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar128._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar128._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar128._12_4_;
          auVar50._16_4_ = fVar158 * 0.0;
          auVar50._20_4_ = fVar189 * 0.0;
          auVar50._24_4_ = fVar196 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar100 = vfmadd231ps_fma(auVar50,auVar119,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar120,ZEXT1632(auVar226));
          fVar189 = auVar102._0_4_;
          fVar158 = auVar102._4_4_;
          fVar196 = auVar102._8_4_;
          fVar197 = auVar102._12_4_;
          auVar123 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar197,
                                        CONCAT48(auVar100._8_4_ * fVar196,
                                                 CONCAT44(auVar100._4_4_ * fVar158,
                                                          auVar100._0_4_ * fVar189))));
          auVar210._4_4_ = uVar211;
          auVar210._0_4_ = uVar211;
          auVar210._8_4_ = uVar211;
          auVar210._12_4_ = uVar211;
          auVar210._16_4_ = uVar211;
          auVar210._20_4_ = uVar211;
          auVar210._24_4_ = uVar211;
          auVar210._28_4_ = uVar211;
          uVar160 = vcmpps_avx512vl(auVar210,auVar123,2);
          uVar159 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar26._4_4_ = uVar159;
          auVar26._0_4_ = uVar159;
          auVar26._8_4_ = uVar159;
          auVar26._12_4_ = uVar159;
          auVar26._16_4_ = uVar159;
          auVar26._20_4_ = uVar159;
          auVar26._24_4_ = uVar159;
          auVar26._28_4_ = uVar159;
          uVar23 = vcmpps_avx512vl(auVar123,auVar26,2);
          bVar97 = (byte)uVar160 & (byte)uVar23 & bVar97;
          if (bVar97 == 0) {
            bVar97 = 0;
            auVar208 = ZEXT3264(auVar110);
            auVar187 = ZEXT3264(auVar112);
          }
          else {
            uVar160 = vcmpps_avx512vl(auVar122,auVar107,4);
            if ((bVar97 & (byte)uVar160) == 0) {
              bVar97 = 0;
              auVar208 = ZEXT3264(auVar110);
              auVar187 = ZEXT3264(auVar112);
            }
            else {
              bVar97 = bVar97 & (byte)uVar160;
              fVar178 = auVar115._0_4_ * fVar189;
              fVar188 = auVar115._4_4_ * fVar158;
              auVar51._4_4_ = fVar188;
              auVar51._0_4_ = fVar178;
              fVar98 = auVar115._8_4_ * fVar196;
              auVar51._8_4_ = fVar98;
              fVar99 = auVar115._12_4_ * fVar197;
              auVar51._12_4_ = fVar99;
              fVar177 = auVar115._16_4_ * 0.0;
              auVar51._16_4_ = fVar177;
              fVar150 = auVar115._20_4_ * 0.0;
              auVar51._20_4_ = fVar150;
              fVar151 = auVar115._24_4_ * 0.0;
              auVar51._24_4_ = fVar151;
              auVar51._28_4_ = auVar115._28_4_;
              fVar189 = auVar116._0_4_ * fVar189;
              fVar158 = auVar116._4_4_ * fVar158;
              auVar52._4_4_ = fVar158;
              auVar52._0_4_ = fVar189;
              fVar196 = auVar116._8_4_ * fVar196;
              auVar52._8_4_ = fVar196;
              fVar197 = auVar116._12_4_ * fVar197;
              auVar52._12_4_ = fVar197;
              fVar152 = auVar116._16_4_ * 0.0;
              auVar52._16_4_ = fVar152;
              fVar154 = auVar116._20_4_ * 0.0;
              auVar52._20_4_ = fVar154;
              fVar155 = auVar116._24_4_ * 0.0;
              auVar52._24_4_ = fVar155;
              auVar52._28_4_ = auVar116._28_4_;
              auVar202._8_4_ = 0x3f800000;
              auVar202._0_8_ = &DAT_3f8000003f800000;
              auVar202._12_4_ = 0x3f800000;
              auVar202._16_4_ = 0x3f800000;
              auVar202._20_4_ = 0x3f800000;
              auVar202._24_4_ = 0x3f800000;
              auVar202._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar202,auVar51);
              bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar21 = SUB81(uVar89 >> 7,0);
              auVar208 = ZEXT3264(CONCAT428((uint)bVar21 * auVar115._28_4_ |
                                            (uint)!bVar21 * auVar112._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar151 |
                                                      (uint)!bVar20 * auVar112._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar150 |
                                                                (uint)!bVar19 * auVar112._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar177 |
                                                                          (uint)!bVar18 *
                                                                          auVar112._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar99 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar112._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar98 |
                                                  (uint)!bVar16 * auVar112._8_4_,
                                                  CONCAT44((uint)bVar15 * (int)fVar188 |
                                                           (uint)!bVar15 * auVar112._4_4_,
                                                           (uint)(bVar88 & 1) * (int)fVar178 |
                                                           (uint)!(bool)(bVar88 & 1) *
                                                           auVar112._0_4_))))))));
              auVar112 = vsubps_avx(auVar202,auVar52);
              bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar21 = SUB81(uVar89 >> 7,0);
              local_360._4_4_ = (uint)bVar15 * (int)fVar158 | (uint)!bVar15 * auVar112._4_4_;
              local_360._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar189 | (uint)!(bool)(bVar88 & 1) * auVar112._0_4_;
              local_360._8_4_ = (uint)bVar16 * (int)fVar196 | (uint)!bVar16 * auVar112._8_4_;
              local_360._12_4_ = (uint)bVar17 * (int)fVar197 | (uint)!bVar17 * auVar112._12_4_;
              local_360._16_4_ = (uint)bVar18 * (int)fVar152 | (uint)!bVar18 * auVar112._16_4_;
              local_360._20_4_ = (uint)bVar19 * (int)fVar154 | (uint)!bVar19 * auVar112._20_4_;
              local_360._24_4_ = (uint)bVar20 * (int)fVar155 | (uint)!bVar20 * auVar112._24_4_;
              local_360._28_4_ = (uint)bVar21 * auVar116._28_4_ | (uint)!bVar21 * auVar112._28_4_;
              auVar187 = ZEXT3264(auVar123);
            }
          }
        }
        auVar229 = ZEXT3264(local_6a0);
        auVar228 = ZEXT3264(local_680);
        if (bVar97 != 0) {
          auVar112 = vsubps_avx(ZEXT1632(auVar101),auVar108);
          auVar122 = auVar208._0_32_;
          auVar102 = vfmadd213ps_fma(auVar112,auVar122,auVar108);
          uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar27._4_4_ = uVar159;
          auVar27._0_4_ = uVar159;
          auVar27._8_4_ = uVar159;
          auVar27._12_4_ = uVar159;
          auVar27._16_4_ = uVar159;
          auVar27._20_4_ = uVar159;
          auVar27._24_4_ = uVar159;
          auVar27._28_4_ = uVar159;
          auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                        CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                                                 CONCAT44(auVar102._4_4_ +
                                                                          auVar102._4_4_,
                                                                          auVar102._0_4_ +
                                                                          auVar102._0_4_)))),auVar27
                                    );
          auVar110 = auVar187._0_32_;
          uVar160 = vcmpps_avx512vl(auVar110,auVar112,6);
          bVar97 = bVar97 & (byte)uVar160;
          if (bVar97 != 0) {
            auVar165._8_4_ = 0xbf800000;
            auVar165._0_8_ = 0xbf800000bf800000;
            auVar165._12_4_ = 0xbf800000;
            auVar165._16_4_ = 0xbf800000;
            auVar165._20_4_ = 0xbf800000;
            auVar165._24_4_ = 0xbf800000;
            auVar165._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_4c0 = vfmadd132ps_avx512vl(local_360,auVar165,auVar28);
            local_360 = local_4c0;
            auVar112 = local_360;
            local_480 = 0;
            local_460 = local_6b0._0_8_;
            uStack_458 = local_6b0._8_8_;
            local_450 = local_6c0._0_8_;
            uStack_448 = local_6c0._8_8_;
            local_440 = local_6d0;
            uStack_438 = uStack_6c8;
            local_360 = auVar112;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar189 = 1.0 / auVar216._0_4_;
              local_420[0] = fVar189 * (auVar208._0_4_ + 0.0);
              local_420[1] = fVar189 * (auVar208._4_4_ + 1.0);
              local_420[2] = fVar189 * (auVar208._8_4_ + 2.0);
              local_420[3] = fVar189 * (auVar208._12_4_ + 3.0);
              fStack_410 = fVar189 * (auVar208._16_4_ + 4.0);
              fStack_40c = fVar189 * (auVar208._20_4_ + 5.0);
              fStack_408 = fVar189 * (auVar208._24_4_ + 6.0);
              fStack_404 = auVar208._28_4_ + 7.0;
              local_360._0_8_ = local_4c0._0_8_;
              local_360._8_8_ = local_4c0._8_8_;
              local_360._16_8_ = local_4c0._16_8_;
              local_360._24_8_ = local_4c0._24_8_;
              local_400 = local_360._0_8_;
              uStack_3f8 = local_360._8_8_;
              uStack_3f0 = local_360._16_8_;
              uStack_3e8 = local_360._24_8_;
              local_3e0 = auVar110;
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar112 = vblendmps_avx512vl(auVar166,auVar110);
              auVar134._0_4_ =
                   (uint)(bVar97 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar15 * auVar112._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar15 * auVar112._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar15 * auVar112._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar15 * auVar112._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar15 * auVar112._20_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar97 >> 6 & 1);
              auVar134._24_4_ = (uint)bVar15 * auVar112._24_4_ | (uint)!bVar15 * 0x7f800000;
              auVar134._28_4_ =
                   (uint)(bVar97 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
              auVar112 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar112 = vminps_avx(auVar134,auVar112);
              auVar123 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar123);
              auVar123 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar123);
              uVar160 = vcmpps_avx512vl(auVar134,auVar112,0);
              bVar87 = (byte)uVar160 & bVar97;
              bVar88 = bVar97;
              if (bVar87 != 0) {
                bVar88 = bVar87;
              }
              uVar91 = 0;
              for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar91 = uVar91 + 1;
              }
              uVar89 = (ulong)uVar91;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar189 = local_420[uVar89];
                uVar159 = *(undefined4 *)((long)&local_400 + uVar89 * 4);
                fVar196 = 1.0 - fVar189;
                fVar158 = fVar196 * fVar196 * -3.0;
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                           ZEXT416((uint)(fVar189 * fVar196)),ZEXT416(0xc0000000));
                auVar100 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar196)),
                                           ZEXT416((uint)(fVar189 * fVar189)),ZEXT416(0x40000000));
                fVar196 = auVar102._0_4_ * 3.0;
                fVar197 = auVar100._0_4_ * 3.0;
                fVar178 = fVar189 * fVar189 * 3.0;
                auVar198._0_4_ = fVar178 * (float)local_6d0._0_4_;
                auVar198._4_4_ = fVar178 * (float)local_6d0._4_4_;
                auVar198._8_4_ = fVar178 * (float)uStack_6c8;
                auVar198._12_4_ = fVar178 * uStack_6c8._4_4_;
                auVar173._4_4_ = fVar197;
                auVar173._0_4_ = fVar197;
                auVar173._8_4_ = fVar197;
                auVar173._12_4_ = fVar197;
                auVar102 = vfmadd132ps_fma(auVar173,auVar198,local_6c0);
                auVar208 = ZEXT3264(auVar122);
                auVar181._4_4_ = fVar196;
                auVar181._0_4_ = fVar196;
                auVar181._8_4_ = fVar196;
                auVar181._12_4_ = fVar196;
                auVar102 = vfmadd132ps_fma(auVar181,auVar102,local_6b0);
                auVar174._4_4_ = fVar158;
                auVar174._0_4_ = fVar158;
                auVar174._8_4_ = fVar158;
                auVar174._12_4_ = fVar158;
                auVar102 = vfmadd213ps_fma(auVar174,auVar22,auVar102);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar89 * 4);
                auVar187 = ZEXT3264(auVar110);
                *(int *)(ray + k * 4 + 0x180) = auVar102._0_4_;
                uVar11 = vextractps_avx(auVar102,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                uVar11 = vextractps_avx(auVar102,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                *(float *)(ray + k * 4 + 0x1e0) = fVar189;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar159;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar95;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_3a0 = vpbroadcastd_avx512vl();
                local_3c0 = vpbroadcastd_avx512vl();
                local_5d0 = local_6b0._0_4_;
                uStack_5cc = local_6b0._4_4_;
                uStack_5c8 = local_6b0._8_8_;
                local_5e0 = local_6c0._0_8_;
                uStack_5d8 = local_6c0._8_8_;
                local_5f0 = (float)local_6d0._0_4_;
                fStack_5ec = (float)local_6d0._4_4_;
                fStack_5e8 = (float)uStack_6c8;
                fStack_5e4 = uStack_6c8._4_4_;
                local_4e0 = auVar122;
                local_4a0 = auVar110;
                local_47c = iVar10;
                local_470 = auVar22;
                local_430 = bVar97;
                do {
                  auVar226 = auVar227._0_16_;
                  local_520._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_280 = local_420[uVar89];
                  local_260 = *(undefined4 *)((long)&local_400 + uVar89 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar89 * 4);
                  local_740.context = context->user;
                  fVar158 = 1.0 - local_280;
                  fVar189 = fVar158 * fVar158 * -3.0;
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),
                                             ZEXT416((uint)(local_280 * fVar158)),
                                             ZEXT416(0xc0000000));
                  auVar100 = vfmsub132ss_fma(ZEXT416((uint)(local_280 * fVar158)),
                                             ZEXT416((uint)(local_280 * local_280)),
                                             ZEXT416(0x40000000));
                  fVar158 = auVar102._0_4_ * 3.0;
                  fVar196 = auVar100._0_4_ * 3.0;
                  fVar197 = local_280 * local_280 * 3.0;
                  auVar201._0_4_ = fVar197 * local_5f0;
                  auVar201._4_4_ = fVar197 * fStack_5ec;
                  auVar201._8_4_ = fVar197 * fStack_5e8;
                  auVar201._12_4_ = fVar197 * fStack_5e4;
                  auVar163._4_4_ = fVar196;
                  auVar163._0_4_ = fVar196;
                  auVar163._8_4_ = fVar196;
                  auVar163._12_4_ = fVar196;
                  auVar84._8_8_ = uStack_5d8;
                  auVar84._0_8_ = local_5e0;
                  auVar102 = vfmadd132ps_fma(auVar163,auVar201,auVar84);
                  auVar184._4_4_ = fVar158;
                  auVar184._0_4_ = fVar158;
                  auVar184._8_4_ = fVar158;
                  auVar184._12_4_ = fVar158;
                  auVar85._4_4_ = uStack_5cc;
                  auVar85._0_4_ = local_5d0;
                  auVar85._8_8_ = uStack_5c8;
                  auVar102 = vfmadd132ps_fma(auVar184,auVar102,auVar85);
                  auVar164._4_4_ = fVar189;
                  auVar164._0_4_ = fVar189;
                  auVar164._8_4_ = fVar189;
                  auVar164._12_4_ = fVar189;
                  auVar102 = vfmadd213ps_fma(auVar164,auVar22,auVar102);
                  local_2e0 = auVar102._0_4_;
                  auVar195._8_4_ = 1;
                  auVar195._0_8_ = 0x100000001;
                  auVar195._12_4_ = 1;
                  auVar195._16_4_ = 1;
                  auVar195._20_4_ = 1;
                  auVar195._24_4_ = 1;
                  auVar195._28_4_ = 1;
                  local_2c0 = vpermps_avx2(auVar195,ZEXT1632(auVar102));
                  auVar205._8_4_ = 2;
                  auVar205._0_8_ = 0x200000002;
                  auVar205._12_4_ = 2;
                  auVar205._16_4_ = 2;
                  auVar205._20_4_ = 2;
                  auVar205._24_4_ = 2;
                  auVar205._28_4_ = 2;
                  local_2a0 = vpermps_avx2(auVar205,ZEXT1632(auVar102));
                  iStack_2dc = local_2e0;
                  iStack_2d8 = local_2e0;
                  iStack_2d4 = local_2e0;
                  iStack_2d0 = local_2e0;
                  iStack_2cc = local_2e0;
                  iStack_2c8 = local_2e0;
                  iStack_2c4 = local_2e0;
                  fStack_27c = local_280;
                  fStack_278 = local_280;
                  fStack_274 = local_280;
                  fStack_270 = local_280;
                  fStack_26c = local_280;
                  fStack_268 = local_280;
                  fStack_264 = local_280;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  local_240 = local_3c0._0_8_;
                  uStack_238 = local_3c0._8_8_;
                  uStack_230 = local_3c0._16_8_;
                  uStack_228 = local_3c0._24_8_;
                  local_220 = local_3a0;
                  auVar112 = vpcmpeqd_avx2(local_3a0,local_3a0);
                  local_708[1] = auVar112;
                  *local_708 = auVar112;
                  local_200 = (local_740.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_740.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_620 = local_300._0_8_;
                  uStack_618 = local_300._8_8_;
                  uStack_610 = local_300._16_8_;
                  uStack_608 = local_300._24_8_;
                  local_740.valid = (int *)&local_620;
                  local_740.geometryUserPtr = *(void **)(CONCAT44(uStack_59c,local_5a0) + 0x18);
                  local_740.hit = (RTCHitN *)&local_2e0;
                  local_740.N = 8;
                  pcVar14 = *(code **)(CONCAT44(uStack_59c,local_5a0) + 0x40);
                  local_580._0_8_ = uVar89;
                  local_740.ray = (RTCRayN *)ray;
                  if (pcVar14 != (code *)0x0) {
                    (*pcVar14)(&local_740);
                    auVar229 = ZEXT3264(local_6a0);
                    auVar228 = ZEXT3264(local_680);
                    auVar222 = ZEXT3264(local_700);
                    auVar223 = ZEXT3264(local_560);
                    auVar225 = ZEXT3264(local_540);
                    in_ZMM21 = ZEXT3264(local_660);
                    in_ZMM20 = ZEXT3264(local_640);
                    auVar102 = vxorps_avx512vl(auVar226,auVar226);
                    auVar227 = ZEXT1664(auVar102);
                    uVar89 = local_580._0_8_;
                    uVar211 = local_5c0._0_4_;
                  }
                  auVar102 = auVar227._0_16_;
                  auVar80._8_8_ = uStack_618;
                  auVar80._0_8_ = local_620;
                  auVar80._16_8_ = uStack_610;
                  auVar80._24_8_ = uStack_608;
                  if (auVar80 == (undefined1  [32])0x0) {
LAB_01d212c8:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_520._0_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_59c,local_5a0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var13)(&local_740);
                      auVar229 = ZEXT3264(local_6a0);
                      auVar228 = ZEXT3264(local_680);
                      auVar222 = ZEXT3264(local_700);
                      auVar223 = ZEXT3264(local_560);
                      auVar225 = ZEXT3264(local_540);
                      in_ZMM21 = ZEXT3264(local_660);
                      in_ZMM20 = ZEXT3264(local_640);
                      auVar102 = vxorps_avx512vl(auVar102,auVar102);
                      auVar227 = ZEXT1664(auVar102);
                      uVar89 = local_580._0_8_;
                      uVar211 = local_5c0._0_4_;
                    }
                    auVar81._8_8_ = uStack_618;
                    auVar81._0_8_ = local_620;
                    auVar81._16_8_ = uStack_610;
                    auVar81._24_8_ = uStack_608;
                    if (auVar81 == (undefined1  [32])0x0) goto LAB_01d212c8;
                    uVar93 = vptestmd_avx512vl(auVar81,auVar81);
                    iVar1 = *(int *)(local_740.hit + 4);
                    iVar2 = *(int *)(local_740.hit + 8);
                    iVar73 = *(int *)(local_740.hit + 0xc);
                    iVar74 = *(int *)(local_740.hit + 0x10);
                    iVar75 = *(int *)(local_740.hit + 0x14);
                    iVar76 = *(int *)(local_740.hit + 0x18);
                    iVar77 = *(int *)(local_740.hit + 0x1c);
                    bVar88 = (byte)uVar93;
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                    bVar21 = SUB81(uVar93 >> 7,0);
                    *(uint *)(local_740.ray + 0x180) =
                         (uint)(bVar88 & 1) * *(int *)local_740.hit |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_740.ray + 0x180);
                    *(uint *)(local_740.ray + 0x184) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x184);
                    *(uint *)(local_740.ray + 0x188) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x188);
                    *(uint *)(local_740.ray + 0x18c) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x18c);
                    *(uint *)(local_740.ray + 400) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 400);
                    *(uint *)(local_740.ray + 0x194) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x194);
                    *(uint *)(local_740.ray + 0x198) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x198);
                    *(uint *)(local_740.ray + 0x19c) =
                         (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x19c);
                    iVar1 = *(int *)(local_740.hit + 0x24);
                    iVar2 = *(int *)(local_740.hit + 0x28);
                    iVar73 = *(int *)(local_740.hit + 0x2c);
                    iVar74 = *(int *)(local_740.hit + 0x30);
                    iVar75 = *(int *)(local_740.hit + 0x34);
                    iVar76 = *(int *)(local_740.hit + 0x38);
                    iVar77 = *(int *)(local_740.hit + 0x3c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                    bVar21 = SUB81(uVar93 >> 7,0);
                    *(uint *)(local_740.ray + 0x1a0) =
                         (uint)(bVar88 & 1) * *(int *)(local_740.hit + 0x20) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_740.ray + 0x1a0);
                    *(uint *)(local_740.ray + 0x1a4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1a4);
                    *(uint *)(local_740.ray + 0x1a8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1a8);
                    *(uint *)(local_740.ray + 0x1ac) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1ac);
                    *(uint *)(local_740.ray + 0x1b0) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1b0);
                    *(uint *)(local_740.ray + 0x1b4) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1b4);
                    *(uint *)(local_740.ray + 0x1b8) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1b8);
                    *(uint *)(local_740.ray + 0x1bc) =
                         (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1bc);
                    iVar1 = *(int *)(local_740.hit + 0x44);
                    iVar2 = *(int *)(local_740.hit + 0x48);
                    iVar73 = *(int *)(local_740.hit + 0x4c);
                    iVar74 = *(int *)(local_740.hit + 0x50);
                    iVar75 = *(int *)(local_740.hit + 0x54);
                    iVar76 = *(int *)(local_740.hit + 0x58);
                    iVar77 = *(int *)(local_740.hit + 0x5c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                    bVar21 = SUB81(uVar93 >> 7,0);
                    *(uint *)(local_740.ray + 0x1c0) =
                         (uint)(bVar88 & 1) * *(int *)(local_740.hit + 0x40) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_740.ray + 0x1c0);
                    *(uint *)(local_740.ray + 0x1c4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1c4);
                    *(uint *)(local_740.ray + 0x1c8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1c8);
                    *(uint *)(local_740.ray + 0x1cc) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1cc);
                    *(uint *)(local_740.ray + 0x1d0) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1d0);
                    *(uint *)(local_740.ray + 0x1d4) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1d4);
                    *(uint *)(local_740.ray + 0x1d8) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1d8);
                    *(uint *)(local_740.ray + 0x1dc) =
                         (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1dc);
                    iVar1 = *(int *)(local_740.hit + 100);
                    iVar2 = *(int *)(local_740.hit + 0x68);
                    iVar73 = *(int *)(local_740.hit + 0x6c);
                    iVar74 = *(int *)(local_740.hit + 0x70);
                    iVar75 = *(int *)(local_740.hit + 0x74);
                    iVar76 = *(int *)(local_740.hit + 0x78);
                    iVar77 = *(int *)(local_740.hit + 0x7c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                    bVar21 = SUB81(uVar93 >> 7,0);
                    *(uint *)(local_740.ray + 0x1e0) =
                         (uint)(bVar88 & 1) * *(int *)(local_740.hit + 0x60) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_740.ray + 0x1e0);
                    *(uint *)(local_740.ray + 0x1e4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1e4);
                    *(uint *)(local_740.ray + 0x1e8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1e8);
                    *(uint *)(local_740.ray + 0x1ec) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1ec);
                    *(uint *)(local_740.ray + 0x1f0) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1f0);
                    *(uint *)(local_740.ray + 500) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 500);
                    *(uint *)(local_740.ray + 0x1f8) =
                         (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1f8);
                    *(uint *)(local_740.ray + 0x1fc) =
                         (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1fc);
                    auVar148._0_4_ =
                         (uint)(bVar88 & 1) * *(int *)(local_740.hit + 0x80) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_740.ray + 0x200);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    auVar148._4_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x84) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x204);
                    bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
                    auVar148._8_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x88) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x208);
                    bVar15 = (bool)((byte)(uVar93 >> 3) & 1);
                    auVar148._12_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x8c) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x20c);
                    bVar15 = (bool)((byte)(uVar93 >> 4) & 1);
                    auVar148._16_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x90) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x210);
                    bVar15 = (bool)((byte)(uVar93 >> 5) & 1);
                    auVar148._20_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x94) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x214);
                    bVar15 = (bool)((byte)(uVar93 >> 6) & 1);
                    auVar148._24_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x98) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x218);
                    bVar15 = SUB81(uVar93 >> 7,0);
                    auVar148._28_4_ =
                         (uint)bVar15 * *(int *)(local_740.hit + 0x9c) |
                         (uint)!bVar15 * *(int *)(local_740.ray + 0x21c);
                    *(undefined1 (*) [32])(local_740.ray + 0x200) = auVar148;
                    auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xa0));
                    *(undefined1 (*) [32])(local_740.ray + 0x220) = auVar112;
                    auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xc0));
                    *(undefined1 (*) [32])(local_740.ray + 0x240) = auVar112;
                    auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xe0));
                    *(undefined1 (*) [32])(local_740.ray + 0x260) = auVar112;
                    auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0x100));
                    *(undefined1 (*) [32])(local_740.ray + 0x280) = auVar112;
                  }
                  auVar208 = ZEXT3264(auVar122);
                  auVar187 = ZEXT3264(auVar110);
                  bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar97;
                  uVar159 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar35._4_4_ = uVar159;
                  auVar35._0_4_ = uVar159;
                  auVar35._8_4_ = uVar159;
                  auVar35._12_4_ = uVar159;
                  auVar35._16_4_ = uVar159;
                  auVar35._20_4_ = uVar159;
                  auVar35._24_4_ = uVar159;
                  auVar35._28_4_ = uVar159;
                  uVar160 = vcmpps_avx512vl(auVar110,auVar35,2);
                  bVar97 = bVar88 & (byte)uVar160;
                  if ((bVar88 & (byte)uVar160) != 0) {
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar171,auVar110);
                    auVar149._0_4_ =
                         (uint)(bVar97 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 1 & 1);
                    auVar149._4_4_ = (uint)bVar15 * auVar112._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 2 & 1);
                    auVar149._8_4_ = (uint)bVar15 * auVar112._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 3 & 1);
                    auVar149._12_4_ = (uint)bVar15 * auVar112._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 4 & 1);
                    auVar149._16_4_ = (uint)bVar15 * auVar112._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 5 & 1);
                    auVar149._20_4_ = (uint)bVar15 * auVar112._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar97 >> 6 & 1);
                    auVar149._24_4_ = (uint)bVar15 * auVar112._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar149._28_4_ =
                         (uint)(bVar97 >> 7) * auVar112._28_4_ |
                         (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                    auVar112 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar112 = vminps_avx(auVar149,auVar112);
                    auVar123 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar123);
                    auVar123 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar123);
                    uVar160 = vcmpps_avx512vl(auVar149,auVar112,0);
                    bVar87 = (byte)uVar160 & bVar97;
                    bVar88 = bVar97;
                    if (bVar87 != 0) {
                      bVar88 = bVar87;
                    }
                    uVar91 = 0;
                    for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar89 = (ulong)uVar91;
                  }
                } while (bVar97 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_580 = vpbroadcastd_avx512vl();
        local_520 = vbroadcastss_avx512vl(auVar103);
        fStack_5b0 = 1.0 / (float)local_500._0_4_;
        local_5c0._4_4_ = fStack_5b0;
        local_5c0._0_4_ = fStack_5b0;
        fStack_5b8 = fStack_5b0;
        fStack_5b4 = fStack_5b0;
        local_500 = vpbroadcastd_avx512vl();
        local_3a0 = vpbroadcastd_avx512vl();
        lVar94 = 8;
        auVar110 = auVar208._0_32_;
        auVar112 = auVar187._0_32_;
        fStack_5ac = fStack_5b0;
        fStack_5a8 = fStack_5b0;
        fStack_5a4 = fStack_5b0;
        local_5a0 = uVar211;
        uStack_59c = uVar211;
        uStack_598 = uVar211;
        uStack_594 = uVar211;
        uStack_590 = uVar211;
        uStack_58c = uVar211;
        uStack_588 = uVar211;
        uStack_584 = uVar211;
        do {
          auVar122 = vpbroadcastd_avx512vl();
          auVar113 = vpor_avx2(auVar122,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar113,local_580,1);
          auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar94 * 4 + lVar24);
          auVar123 = *(undefined1 (*) [32])(lVar24 + 0x2227768 + lVar94 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar24 + 0x2227bec + lVar94 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar24 + 0x2228070 + lVar94 * 4);
          local_680 = auVar228._0_32_;
          auVar114 = vmulps_avx512vl(local_680,auVar111);
          local_6a0 = auVar229._0_32_;
          auVar120 = vmulps_avx512vl(local_6a0,auVar111);
          auVar53._4_4_ = auVar111._4_4_ * (float)local_140._4_4_;
          auVar53._0_4_ = auVar111._0_4_ * (float)local_140._0_4_;
          auVar53._8_4_ = auVar111._8_4_ * fStack_138;
          auVar53._12_4_ = auVar111._12_4_ * fStack_134;
          auVar53._16_4_ = auVar111._16_4_ * fStack_130;
          auVar53._20_4_ = auVar111._20_4_ * fStack_12c;
          auVar53._24_4_ = auVar111._24_4_ * fStack_128;
          auVar53._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar114,auVar121,local_a0);
          auVar114 = vfmadd231ps_avx512vl(auVar120,auVar121,local_c0);
          auVar120 = vfmadd231ps_avx512vl(auVar53,auVar121,local_120);
          auVar206 = auVar222._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,auVar206);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_340);
          auVar103 = vfmadd231ps_fma(auVar120,auVar123,local_100);
          auVar209 = auVar225._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar113,auVar122,auVar209);
          auVar207 = auVar223._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar114,auVar122,auVar207);
          auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar94 * 4 + lVar24);
          auVar114 = *(undefined1 (*) [32])(lVar24 + 0x2229b88 + lVar94 * 4);
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar122,local_e0);
          auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222a00c + lVar94 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar24 + 0x222a490 + lVar94 * 4);
          auVar109 = vmulps_avx512vl(local_680,auVar119);
          auVar115 = vmulps_avx512vl(local_6a0,auVar119);
          auVar54._4_4_ = auVar119._4_4_ * (float)local_140._4_4_;
          auVar54._0_4_ = auVar119._0_4_ * (float)local_140._0_4_;
          auVar54._8_4_ = auVar119._8_4_ * fStack_138;
          auVar54._12_4_ = auVar119._12_4_ * fStack_134;
          auVar54._16_4_ = auVar119._16_4_ * fStack_130;
          auVar54._20_4_ = auVar119._20_4_ * fStack_12c;
          auVar54._24_4_ = auVar119._24_4_ * fStack_128;
          auVar54._28_4_ = uStack_124;
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_a0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,local_c0);
          auVar108 = vfmadd231ps_avx512vl(auVar54,auVar120,local_120);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar206);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar114,local_340);
          auVar102 = vfmadd231ps_fma(auVar108,auVar114,local_100);
          auVar108 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar209);
          auVar117 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar207);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar113,local_e0);
          auVar118 = vmaxps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar102));
          auVar109 = vsubps_avx(auVar108,auVar116);
          auVar115 = vsubps_avx(auVar117,auVar107);
          auVar135 = vmulps_avx512vl(auVar107,auVar109);
          auVar136 = vmulps_avx512vl(auVar116,auVar115);
          auVar135 = vsubps_avx512vl(auVar135,auVar136);
          auVar136 = vmulps_avx512vl(auVar115,auVar115);
          auVar136 = vfmadd231ps_avx512vl(auVar136,auVar109,auVar109);
          auVar118 = vmulps_avx512vl(auVar118,auVar118);
          auVar118 = vmulps_avx512vl(auVar118,auVar136);
          auVar135 = vmulps_avx512vl(auVar135,auVar135);
          uVar160 = vcmpps_avx512vl(auVar135,auVar118,2);
          local_430 = (byte)uVar23 & (byte)uVar160;
          if (local_430 == 0) {
            auVar224 = ZEXT3264(auVar207);
            auVar222 = ZEXT3264(auVar206);
          }
          else {
            auVar119 = vmulps_avx512vl(local_1c0,auVar119);
            auVar120 = vfmadd213ps_avx512vl(auVar120,local_1a0,auVar119);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_180,auVar120);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar114);
            auVar111 = vmulps_avx512vl(local_1c0,auVar111);
            auVar121 = vfmadd213ps_avx512vl(auVar121,local_1a0,auVar111);
            auVar123 = vfmadd213ps_avx512vl(auVar123,local_180,auVar121);
            auVar114 = vfmadd213ps_avx512vl(auVar122,local_160,auVar123);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x22284f4 + lVar94 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar24 + 0x2228978 + lVar94 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x2228dfc + lVar94 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar24 + 0x2229280 + lVar94 * 4);
            auVar120 = vmulps_avx512vl(local_680,auVar111);
            auVar119 = vmulps_avx512vl(local_6a0,auVar111);
            auVar111 = vmulps_avx512vl(local_1c0,auVar111);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar121,local_a0);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar121,local_c0);
            auVar121 = vfmadd231ps_avx512vl(auVar111,local_1a0,auVar121);
            auVar111 = vfmadd231ps_avx512vl(auVar120,auVar123,auVar206);
            auVar120 = vfmadd231ps_avx512vl(auVar119,auVar123,local_340);
            auVar123 = vfmadd231ps_avx512vl(auVar121,local_180,auVar123);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar122,auVar209);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar122,auVar207);
            auVar119 = vfmadd231ps_avx512vl(auVar123,local_160,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x222a914 + lVar94 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar24 + 0x222b21c + lVar94 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x222b6a0 + lVar94 * 4);
            auVar118 = vmulps_avx512vl(local_680,auVar121);
            auVar135 = vmulps_avx512vl(local_6a0,auVar121);
            auVar121 = vmulps_avx512vl(local_1c0,auVar121);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar123,local_a0);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar123,local_c0);
            auVar121 = vfmadd231ps_avx512vl(auVar121,local_1a0,auVar123);
            auVar123 = *(undefined1 (*) [32])(lVar24 + 0x222ad98 + lVar94 * 4);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar123,auVar206);
            auVar100 = vfmadd231ps_fma(auVar135,auVar123,local_340);
            auVar123 = vfmadd231ps_avx512vl(auVar121,local_180,auVar123);
            auVar121 = vfmadd231ps_avx512vl(auVar118,auVar122,auVar209);
            auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar122,auVar207);
            auVar123 = vfmadd231ps_avx512vl(auVar123,local_160,auVar122);
            auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar111,auVar135);
            vandps_avx512vl(auVar120,auVar135);
            auVar122 = vmaxps_avx(auVar135,auVar135);
            vandps_avx512vl(auVar119,auVar135);
            auVar122 = vmaxps_avx(auVar122,auVar135);
            uVar89 = vcmpps_avx512vl(auVar122,local_520,1);
            bVar15 = (bool)((byte)uVar89 & 1);
            auVar137._0_4_ = (float)((uint)bVar15 * auVar109._0_4_ | (uint)!bVar15 * auVar111._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar15 * auVar109._4_4_ | (uint)!bVar15 * auVar111._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * auVar111._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar15 * auVar109._12_4_ | (uint)!bVar15 * auVar111._12_4_);
            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar137._16_4_ =
                 (float)((uint)bVar15 * auVar109._16_4_ | (uint)!bVar15 * auVar111._16_4_);
            bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar137._20_4_ =
                 (float)((uint)bVar15 * auVar109._20_4_ | (uint)!bVar15 * auVar111._20_4_);
            bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar137._24_4_ =
                 (float)((uint)bVar15 * auVar109._24_4_ | (uint)!bVar15 * auVar111._24_4_);
            bVar15 = SUB81(uVar89 >> 7,0);
            auVar137._28_4_ = (uint)bVar15 * auVar109._28_4_ | (uint)!bVar15 * auVar111._28_4_;
            bVar15 = (bool)((byte)uVar89 & 1);
            auVar138._0_4_ = (float)((uint)bVar15 * auVar115._0_4_ | (uint)!bVar15 * auVar120._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar120._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar120._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar120._12_4_);
            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar15 * auVar115._16_4_ | (uint)!bVar15 * auVar120._16_4_);
            bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar15 * auVar115._20_4_ | (uint)!bVar15 * auVar120._20_4_);
            bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar15 * auVar115._24_4_ | (uint)!bVar15 * auVar120._24_4_);
            bVar15 = SUB81(uVar89 >> 7,0);
            auVar138._28_4_ = (uint)bVar15 * auVar115._28_4_ | (uint)!bVar15 * auVar120._28_4_;
            vandps_avx512vl(auVar121,auVar135);
            vandps_avx512vl(auVar118,auVar135);
            auVar122 = vmaxps_avx(auVar138,auVar138);
            vandps_avx512vl(auVar123,auVar135);
            auVar122 = vmaxps_avx(auVar122,auVar138);
            uVar89 = vcmpps_avx512vl(auVar122,local_520,1);
            bVar15 = (bool)((byte)uVar89 & 1);
            auVar139._0_4_ = (uint)bVar15 * auVar109._0_4_ | (uint)!bVar15 * auVar121._0_4_;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar139._4_4_ = (uint)bVar15 * auVar109._4_4_ | (uint)!bVar15 * auVar121._4_4_;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar139._8_4_ = (uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * auVar121._8_4_;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar139._12_4_ = (uint)bVar15 * auVar109._12_4_ | (uint)!bVar15 * auVar121._12_4_;
            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar139._16_4_ = (uint)bVar15 * auVar109._16_4_ | (uint)!bVar15 * auVar121._16_4_;
            bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar139._20_4_ = (uint)bVar15 * auVar109._20_4_ | (uint)!bVar15 * auVar121._20_4_;
            bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar139._24_4_ = (uint)bVar15 * auVar109._24_4_ | (uint)!bVar15 * auVar121._24_4_;
            bVar15 = SUB81(uVar89 >> 7,0);
            auVar139._28_4_ = (uint)bVar15 * auVar109._28_4_ | (uint)!bVar15 * auVar121._28_4_;
            bVar15 = (bool)((byte)uVar89 & 1);
            auVar140._0_4_ = (float)((uint)bVar15 * auVar115._0_4_ | (uint)!bVar15 * auVar118._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar118._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar118._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar118._12_4_);
            bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar140._16_4_ =
                 (float)((uint)bVar15 * auVar115._16_4_ | (uint)!bVar15 * auVar118._16_4_);
            bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar140._20_4_ =
                 (float)((uint)bVar15 * auVar115._20_4_ | (uint)!bVar15 * auVar118._20_4_);
            bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar140._24_4_ =
                 (float)((uint)bVar15 * auVar115._24_4_ | (uint)!bVar15 * auVar118._24_4_);
            bVar15 = SUB81(uVar89 >> 7,0);
            auVar140._28_4_ = (uint)bVar15 * auVar115._28_4_ | (uint)!bVar15 * auVar118._28_4_;
            auVar213._8_4_ = 0x80000000;
            auVar213._0_8_ = 0x8000000080000000;
            auVar213._12_4_ = 0x80000000;
            auVar213._16_4_ = 0x80000000;
            auVar213._20_4_ = 0x80000000;
            auVar213._24_4_ = 0x80000000;
            auVar213._28_4_ = 0x80000000;
            auVar122 = vxorps_avx512vl(auVar139,auVar213);
            auVar118 = auVar227._0_32_;
            auVar123 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar118);
            auVar100 = vfmadd231ps_fma(auVar123,auVar138,auVar138);
            auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
            auVar221._8_4_ = 0xbf000000;
            auVar221._0_8_ = 0xbf000000bf000000;
            auVar221._12_4_ = 0xbf000000;
            auVar221._16_4_ = 0xbf000000;
            auVar221._20_4_ = 0xbf000000;
            auVar221._24_4_ = 0xbf000000;
            auVar221._28_4_ = 0xbf000000;
            fVar189 = auVar123._0_4_;
            fVar158 = auVar123._4_4_;
            fVar196 = auVar123._8_4_;
            fVar197 = auVar123._12_4_;
            fVar178 = auVar123._16_4_;
            fVar188 = auVar123._20_4_;
            fVar98 = auVar123._24_4_;
            auVar55._4_4_ = fVar158 * fVar158 * fVar158 * auVar100._4_4_ * -0.5;
            auVar55._0_4_ = fVar189 * fVar189 * fVar189 * auVar100._0_4_ * -0.5;
            auVar55._8_4_ = fVar196 * fVar196 * fVar196 * auVar100._8_4_ * -0.5;
            auVar55._12_4_ = fVar197 * fVar197 * fVar197 * auVar100._12_4_ * -0.5;
            auVar55._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
            auVar55._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar55._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
            auVar55._28_4_ = auVar138._28_4_;
            auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar123 = vfmadd231ps_avx512vl(auVar55,auVar121,auVar123);
            auVar56._4_4_ = auVar138._4_4_ * auVar123._4_4_;
            auVar56._0_4_ = auVar138._0_4_ * auVar123._0_4_;
            auVar56._8_4_ = auVar138._8_4_ * auVar123._8_4_;
            auVar56._12_4_ = auVar138._12_4_ * auVar123._12_4_;
            auVar56._16_4_ = auVar138._16_4_ * auVar123._16_4_;
            auVar56._20_4_ = auVar138._20_4_ * auVar123._20_4_;
            auVar56._24_4_ = auVar138._24_4_ * auVar123._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar123._4_4_ * -auVar137._4_4_;
            auVar57._0_4_ = auVar123._0_4_ * -auVar137._0_4_;
            auVar57._8_4_ = auVar123._8_4_ * -auVar137._8_4_;
            auVar57._12_4_ = auVar123._12_4_ * -auVar137._12_4_;
            auVar57._16_4_ = auVar123._16_4_ * -auVar137._16_4_;
            auVar57._20_4_ = auVar123._20_4_ * -auVar137._20_4_;
            auVar57._24_4_ = auVar123._24_4_ * -auVar137._24_4_;
            auVar57._28_4_ = auVar138._28_4_;
            auVar111 = vmulps_avx512vl(auVar123,auVar118);
            auVar123 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar118);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar140,auVar140);
            auVar120 = vrsqrt14ps_avx512vl(auVar123);
            auVar123 = vmulps_avx512vl(auVar123,auVar221);
            fVar189 = auVar120._0_4_;
            fVar158 = auVar120._4_4_;
            fVar196 = auVar120._8_4_;
            fVar197 = auVar120._12_4_;
            fVar178 = auVar120._16_4_;
            fVar188 = auVar120._20_4_;
            fVar98 = auVar120._24_4_;
            auVar58._4_4_ = fVar158 * fVar158 * fVar158 * auVar123._4_4_;
            auVar58._0_4_ = fVar189 * fVar189 * fVar189 * auVar123._0_4_;
            auVar58._8_4_ = fVar196 * fVar196 * fVar196 * auVar123._8_4_;
            auVar58._12_4_ = fVar197 * fVar197 * fVar197 * auVar123._12_4_;
            auVar58._16_4_ = fVar178 * fVar178 * fVar178 * auVar123._16_4_;
            auVar58._20_4_ = fVar188 * fVar188 * fVar188 * auVar123._20_4_;
            auVar58._24_4_ = fVar98 * fVar98 * fVar98 * auVar123._24_4_;
            auVar58._28_4_ = auVar123._28_4_;
            auVar123 = vfmadd231ps_avx512vl(auVar58,auVar121,auVar120);
            auVar59._4_4_ = auVar140._4_4_ * auVar123._4_4_;
            auVar59._0_4_ = auVar140._0_4_ * auVar123._0_4_;
            auVar59._8_4_ = auVar140._8_4_ * auVar123._8_4_;
            auVar59._12_4_ = auVar140._12_4_ * auVar123._12_4_;
            auVar59._16_4_ = auVar140._16_4_ * auVar123._16_4_;
            auVar59._20_4_ = auVar140._20_4_ * auVar123._20_4_;
            auVar59._24_4_ = auVar140._24_4_ * auVar123._24_4_;
            auVar59._28_4_ = auVar120._28_4_;
            auVar60._4_4_ = auVar123._4_4_ * auVar122._4_4_;
            auVar60._0_4_ = auVar123._0_4_ * auVar122._0_4_;
            auVar60._8_4_ = auVar123._8_4_ * auVar122._8_4_;
            auVar60._12_4_ = auVar123._12_4_ * auVar122._12_4_;
            auVar60._16_4_ = auVar123._16_4_ * auVar122._16_4_;
            auVar60._20_4_ = auVar123._20_4_ * auVar122._20_4_;
            auVar60._24_4_ = auVar123._24_4_ * auVar122._24_4_;
            auVar60._28_4_ = auVar122._28_4_;
            auVar122 = vmulps_avx512vl(auVar123,auVar118);
            auVar100 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar103),auVar116);
            auVar123 = ZEXT1632(auVar103);
            auVar226 = vfmadd213ps_fma(auVar57,auVar123,auVar107);
            auVar121 = vfmadd213ps_avx512vl(auVar111,auVar123,auVar114);
            auVar120 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar102),auVar108);
            auVar104 = vfnmadd213ps_fma(auVar56,auVar123,auVar116);
            auVar119 = ZEXT1632(auVar102);
            auVar6 = vfmadd213ps_fma(auVar60,auVar119,auVar117);
            auVar105 = vfnmadd213ps_fma(auVar57,auVar123,auVar107);
            auVar7 = vfmadd213ps_fma(auVar122,auVar119,auVar113);
            auVar107 = ZEXT1632(auVar103);
            auVar212 = vfnmadd231ps_fma(auVar114,auVar107,auVar111);
            auVar179 = vfnmadd213ps_fma(auVar59,auVar119,auVar108);
            auVar180 = vfnmadd213ps_fma(auVar60,auVar119,auVar117);
            auVar106 = vfnmadd231ps_fma(auVar113,ZEXT1632(auVar102),auVar122);
            auVar113 = vsubps_avx512vl(auVar120,ZEXT1632(auVar104));
            auVar122 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar105));
            auVar123 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar212));
            auVar61._4_4_ = auVar122._4_4_ * auVar212._4_4_;
            auVar61._0_4_ = auVar122._0_4_ * auVar212._0_4_;
            auVar61._8_4_ = auVar122._8_4_ * auVar212._8_4_;
            auVar61._12_4_ = auVar122._12_4_ * auVar212._12_4_;
            auVar61._16_4_ = auVar122._16_4_ * 0.0;
            auVar61._20_4_ = auVar122._20_4_ * 0.0;
            auVar61._24_4_ = auVar122._24_4_ * 0.0;
            auVar61._28_4_ = auVar111._28_4_;
            auVar103 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar105),auVar123);
            auVar62._4_4_ = auVar123._4_4_ * auVar104._4_4_;
            auVar62._0_4_ = auVar123._0_4_ * auVar104._0_4_;
            auVar62._8_4_ = auVar123._8_4_ * auVar104._8_4_;
            auVar62._12_4_ = auVar123._12_4_ * auVar104._12_4_;
            auVar62._16_4_ = auVar123._16_4_ * 0.0;
            auVar62._20_4_ = auVar123._20_4_ * 0.0;
            auVar62._24_4_ = auVar123._24_4_ * 0.0;
            auVar62._28_4_ = auVar123._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar212),auVar113);
            auVar63._4_4_ = auVar105._4_4_ * auVar113._4_4_;
            auVar63._0_4_ = auVar105._0_4_ * auVar113._0_4_;
            auVar63._8_4_ = auVar105._8_4_ * auVar113._8_4_;
            auVar63._12_4_ = auVar105._12_4_ * auVar113._12_4_;
            auVar63._16_4_ = auVar113._16_4_ * 0.0;
            auVar63._20_4_ = auVar113._20_4_ * 0.0;
            auVar63._24_4_ = auVar113._24_4_ * 0.0;
            auVar63._28_4_ = auVar113._28_4_;
            auVar101 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar104),auVar122);
            auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar118,ZEXT1632(auVar8));
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,ZEXT1632(auVar103));
            uVar89 = vcmpps_avx512vl(auVar122,auVar118,2);
            bVar97 = (byte)uVar89;
            fVar150 = (float)((uint)(bVar97 & 1) * auVar100._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * auVar179._0_4_);
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar152 = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar179._4_4_);
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar155 = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar179._8_4_);
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar156 = (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar179._12_4_);
            auVar119 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar155,CONCAT44(fVar152,fVar150))));
            fVar151 = (float)((uint)(bVar97 & 1) * auVar226._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * auVar180._0_4_);
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar154 = (float)((uint)bVar15 * auVar226._4_4_ | (uint)!bVar15 * auVar180._4_4_);
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar153 = (float)((uint)bVar15 * auVar226._8_4_ | (uint)!bVar15 * auVar180._8_4_);
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar157 = (float)((uint)bVar15 * auVar226._12_4_ | (uint)!bVar15 * auVar180._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar153,CONCAT44(fVar154,fVar151))));
            auVar141._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar121._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar106._0_4_);
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar106._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar106._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar106._12_4_);
            fVar196 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_);
            auVar141._16_4_ = fVar196;
            fVar158 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_);
            auVar141._20_4_ = fVar158;
            fVar189 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_);
            auVar141._24_4_ = fVar189;
            iVar1 = (uint)(byte)(uVar89 >> 7) * auVar121._28_4_;
            auVar141._28_4_ = iVar1;
            auVar122 = vblendmps_avx512vl(ZEXT1632(auVar104),auVar120);
            auVar142._0_4_ =
                 (uint)(bVar97 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar103._0_4_;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar142._4_4_ = (uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * auVar103._4_4_;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar142._8_4_ = (uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * auVar103._8_4_;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar142._12_4_ = (uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * auVar103._12_4_;
            auVar142._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar122._16_4_;
            auVar142._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar122._20_4_;
            auVar142._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar122._24_4_;
            auVar142._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar122._28_4_;
            auVar122 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar6));
            auVar143._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar122._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar100._0_4_);
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * auVar100._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * auVar100._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * auVar100._12_4_);
            fVar188 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar122._16_4_);
            auVar143._16_4_ = fVar188;
            fVar178 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar122._20_4_);
            auVar143._20_4_ = fVar178;
            fVar197 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar122._24_4_);
            auVar143._24_4_ = fVar197;
            auVar143._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar122._28_4_;
            auVar122 = vblendmps_avx512vl(ZEXT1632(auVar212),ZEXT1632(auVar7));
            auVar144._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar122._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar226._0_4_);
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * auVar226._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * auVar226._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * auVar226._12_4_);
            fVar99 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar122._16_4_);
            auVar144._16_4_ = fVar99;
            fVar98 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar122._20_4_);
            auVar144._20_4_ = fVar98;
            fVar177 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar122._24_4_);
            auVar144._24_4_ = fVar177;
            iVar2 = (uint)(byte)(uVar89 >> 7) * auVar122._28_4_;
            auVar144._28_4_ = iVar2;
            auVar145._0_4_ =
                 (uint)(bVar97 & 1) * (int)auVar104._0_4_ |
                 (uint)!(bool)(bVar97 & 1) * auVar120._0_4_;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar145._4_4_ = (uint)bVar15 * (int)auVar104._4_4_ | (uint)!bVar15 * auVar120._4_4_;
            bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar145._8_4_ = (uint)bVar15 * (int)auVar104._8_4_ | (uint)!bVar15 * auVar120._8_4_;
            bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar145._12_4_ = (uint)bVar15 * (int)auVar104._12_4_ | (uint)!bVar15 * auVar120._12_4_;
            auVar145._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar120._16_4_;
            auVar145._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar120._20_4_;
            auVar145._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar120._24_4_;
            auVar145._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar120._28_4_;
            bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar120 = vsubps_avx512vl(auVar145,auVar119);
            auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar105._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar105._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar105._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar97 & 1) *
                                                                       (int)auVar105._0_4_ |
                                                                       (uint)!(bool)(bVar97 & 1) *
                                                                       auVar6._0_4_)))),auVar109);
            auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar212._12_4_ |
                                                     (uint)!bVar20 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar212._8_4_ |
                                                              (uint)!bVar18 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar212._4_4_ |
                                                                       (uint)!bVar16 * auVar7._4_4_,
                                                                       (uint)(bVar97 & 1) *
                                                                       (int)auVar212._0_4_ |
                                                                       (uint)!(bool)(bVar97 & 1) *
                                                                       auVar7._0_4_)))),auVar141);
            auVar111 = vsubps_avx(auVar119,auVar142);
            auVar113 = vsubps_avx(auVar109,auVar143);
            auVar114 = vsubps_avx(auVar141,auVar144);
            auVar64._4_4_ = auVar121._4_4_ * fVar152;
            auVar64._0_4_ = auVar121._0_4_ * fVar150;
            auVar64._8_4_ = auVar121._8_4_ * fVar155;
            auVar64._12_4_ = auVar121._12_4_ * fVar156;
            auVar64._16_4_ = auVar121._16_4_ * 0.0;
            auVar64._20_4_ = auVar121._20_4_ * 0.0;
            auVar64._24_4_ = auVar121._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar64,auVar141,auVar120);
            auVar186._0_4_ = fVar151 * auVar120._0_4_;
            auVar186._4_4_ = fVar154 * auVar120._4_4_;
            auVar186._8_4_ = fVar153 * auVar120._8_4_;
            auVar186._12_4_ = fVar157 * auVar120._12_4_;
            auVar186._16_4_ = auVar120._16_4_ * 0.0;
            auVar186._20_4_ = auVar120._20_4_ * 0.0;
            auVar186._24_4_ = auVar120._24_4_ * 0.0;
            auVar186._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar186,auVar119,auVar123);
            auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar118,ZEXT1632(auVar103));
            auVar192._0_4_ = auVar123._0_4_ * auVar141._0_4_;
            auVar192._4_4_ = auVar123._4_4_ * auVar141._4_4_;
            auVar192._8_4_ = auVar123._8_4_ * auVar141._8_4_;
            auVar192._12_4_ = auVar123._12_4_ * auVar141._12_4_;
            auVar192._16_4_ = auVar123._16_4_ * fVar196;
            auVar192._20_4_ = auVar123._20_4_ * fVar158;
            auVar192._24_4_ = auVar123._24_4_ * fVar189;
            auVar192._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar192,auVar109,auVar121);
            auVar115 = vfmadd231ps_avx512vl(auVar122,auVar118,ZEXT1632(auVar103));
            auVar122 = vmulps_avx512vl(auVar114,auVar142);
            auVar122 = vfmsub231ps_avx512vl(auVar122,auVar111,auVar144);
            auVar65._4_4_ = auVar113._4_4_ * auVar144._4_4_;
            auVar65._0_4_ = auVar113._0_4_ * auVar144._0_4_;
            auVar65._8_4_ = auVar113._8_4_ * auVar144._8_4_;
            auVar65._12_4_ = auVar113._12_4_ * auVar144._12_4_;
            auVar65._16_4_ = auVar113._16_4_ * fVar99;
            auVar65._20_4_ = auVar113._20_4_ * fVar98;
            auVar65._24_4_ = auVar113._24_4_ * fVar177;
            auVar65._28_4_ = iVar2;
            auVar103 = vfmsub231ps_fma(auVar65,auVar143,auVar114);
            auVar193._0_4_ = auVar143._0_4_ * auVar111._0_4_;
            auVar193._4_4_ = auVar143._4_4_ * auVar111._4_4_;
            auVar193._8_4_ = auVar143._8_4_ * auVar111._8_4_;
            auVar193._12_4_ = auVar143._12_4_ * auVar111._12_4_;
            auVar193._16_4_ = fVar188 * auVar111._16_4_;
            auVar193._20_4_ = fVar178 * auVar111._20_4_;
            auVar193._24_4_ = fVar197 * auVar111._24_4_;
            auVar193._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar193,auVar113,auVar142);
            auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar118,auVar122);
            auVar116 = vfmadd231ps_avx512vl(auVar122,auVar118,ZEXT1632(auVar103));
            auVar122 = vmaxps_avx(auVar115,auVar116);
            uVar160 = vcmpps_avx512vl(auVar122,auVar118,2);
            local_430 = local_430 & (byte)uVar160;
            auVar224 = ZEXT3264(auVar207);
            if (local_430 == 0) {
LAB_01d20937:
              local_430 = 0;
            }
            else {
              auVar66._4_4_ = auVar114._4_4_ * auVar123._4_4_;
              auVar66._0_4_ = auVar114._0_4_ * auVar123._0_4_;
              auVar66._8_4_ = auVar114._8_4_ * auVar123._8_4_;
              auVar66._12_4_ = auVar114._12_4_ * auVar123._12_4_;
              auVar66._16_4_ = auVar114._16_4_ * auVar123._16_4_;
              auVar66._20_4_ = auVar114._20_4_ * auVar123._20_4_;
              auVar66._24_4_ = auVar114._24_4_ * auVar123._24_4_;
              auVar66._28_4_ = auVar122._28_4_;
              auVar226 = vfmsub231ps_fma(auVar66,auVar113,auVar121);
              auVar67._4_4_ = auVar121._4_4_ * auVar111._4_4_;
              auVar67._0_4_ = auVar121._0_4_ * auVar111._0_4_;
              auVar67._8_4_ = auVar121._8_4_ * auVar111._8_4_;
              auVar67._12_4_ = auVar121._12_4_ * auVar111._12_4_;
              auVar67._16_4_ = auVar121._16_4_ * auVar111._16_4_;
              auVar67._20_4_ = auVar121._20_4_ * auVar111._20_4_;
              auVar67._24_4_ = auVar121._24_4_ * auVar111._24_4_;
              auVar67._28_4_ = auVar121._28_4_;
              auVar100 = vfmsub231ps_fma(auVar67,auVar120,auVar114);
              auVar68._4_4_ = auVar113._4_4_ * auVar120._4_4_;
              auVar68._0_4_ = auVar113._0_4_ * auVar120._0_4_;
              auVar68._8_4_ = auVar113._8_4_ * auVar120._8_4_;
              auVar68._12_4_ = auVar113._12_4_ * auVar120._12_4_;
              auVar68._16_4_ = auVar113._16_4_ * auVar120._16_4_;
              auVar68._20_4_ = auVar113._20_4_ * auVar120._20_4_;
              auVar68._24_4_ = auVar113._24_4_ * auVar120._24_4_;
              auVar68._28_4_ = auVar113._28_4_;
              auVar6 = vfmsub231ps_fma(auVar68,auVar111,auVar123);
              auVar103 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar6));
              auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar226),auVar118);
              auVar123 = vrcp14ps_avx512vl(auVar122);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar121 = vfnmadd213ps_avx512vl(auVar123,auVar122,auVar30);
              auVar103 = vfmadd132ps_fma(auVar121,auVar123,auVar123);
              auVar69._4_4_ = auVar6._4_4_ * auVar141._4_4_;
              auVar69._0_4_ = auVar6._0_4_ * auVar141._0_4_;
              auVar69._8_4_ = auVar6._8_4_ * auVar141._8_4_;
              auVar69._12_4_ = auVar6._12_4_ * auVar141._12_4_;
              auVar69._16_4_ = fVar196 * 0.0;
              auVar69._20_4_ = fVar158 * 0.0;
              auVar69._24_4_ = fVar189 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar100 = vfmadd231ps_fma(auVar69,auVar109,ZEXT1632(auVar100));
              auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar119,ZEXT1632(auVar226));
              fVar189 = auVar103._0_4_;
              fVar158 = auVar103._4_4_;
              fVar196 = auVar103._8_4_;
              fVar197 = auVar103._12_4_;
              auVar123 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar197,
                                            CONCAT48(auVar100._8_4_ * fVar196,
                                                     CONCAT44(auVar100._4_4_ * fVar158,
                                                              auVar100._0_4_ * fVar189))));
              auVar86._4_4_ = uStack_59c;
              auVar86._0_4_ = local_5a0;
              auVar86._8_4_ = uStack_598;
              auVar86._12_4_ = uStack_594;
              auVar86._16_4_ = uStack_590;
              auVar86._20_4_ = uStack_58c;
              auVar86._24_4_ = uStack_588;
              auVar86._28_4_ = uStack_584;
              uVar160 = vcmpps_avx512vl(auVar123,auVar86,0xd);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar31._4_4_ = uVar159;
              auVar31._0_4_ = uVar159;
              auVar31._8_4_ = uVar159;
              auVar31._12_4_ = uVar159;
              auVar31._16_4_ = uVar159;
              auVar31._20_4_ = uVar159;
              auVar31._24_4_ = uVar159;
              auVar31._28_4_ = uVar159;
              uVar23 = vcmpps_avx512vl(auVar123,auVar31,2);
              local_430 = (byte)uVar160 & (byte)uVar23 & local_430;
              if (local_430 == 0) goto LAB_01d20937;
              uVar160 = vcmpps_avx512vl(auVar122,auVar118,4);
              if ((local_430 & (byte)uVar160) == 0) {
                local_430 = 0;
              }
              else {
                local_430 = local_430 & (byte)uVar160;
                fVar178 = auVar115._0_4_ * fVar189;
                fVar188 = auVar115._4_4_ * fVar158;
                auVar70._4_4_ = fVar188;
                auVar70._0_4_ = fVar178;
                fVar98 = auVar115._8_4_ * fVar196;
                auVar70._8_4_ = fVar98;
                fVar99 = auVar115._12_4_ * fVar197;
                auVar70._12_4_ = fVar99;
                fVar177 = auVar115._16_4_ * 0.0;
                auVar70._16_4_ = fVar177;
                fVar150 = auVar115._20_4_ * 0.0;
                auVar70._20_4_ = fVar150;
                fVar151 = auVar115._24_4_ * 0.0;
                auVar70._24_4_ = fVar151;
                auVar70._28_4_ = auVar115._28_4_;
                fVar189 = auVar116._0_4_ * fVar189;
                fVar158 = auVar116._4_4_ * fVar158;
                auVar71._4_4_ = fVar158;
                auVar71._0_4_ = fVar189;
                fVar196 = auVar116._8_4_ * fVar196;
                auVar71._8_4_ = fVar196;
                fVar197 = auVar116._12_4_ * fVar197;
                auVar71._12_4_ = fVar197;
                fVar152 = auVar116._16_4_ * 0.0;
                auVar71._16_4_ = fVar152;
                fVar154 = auVar116._20_4_ * 0.0;
                auVar71._20_4_ = fVar154;
                fVar155 = auVar116._24_4_ * 0.0;
                auVar71._24_4_ = fVar155;
                auVar71._28_4_ = auVar116._28_4_;
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = &DAT_3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar203._16_4_ = 0x3f800000;
                auVar203._20_4_ = 0x3f800000;
                auVar203._24_4_ = 0x3f800000;
                auVar203._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx512vl(auVar203,auVar70);
                bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar21 = SUB81(uVar89 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar115._28_4_ |
                                              (uint)!bVar21 * auVar122._28_4_,
                                              CONCAT424((uint)bVar20 * (int)fVar151 |
                                                        (uint)!bVar20 * auVar122._24_4_,
                                                        CONCAT420((uint)bVar19 * (int)fVar150 |
                                                                  (uint)!bVar19 * auVar122._20_4_,
                                                                  CONCAT416((uint)bVar18 *
                                                                            (int)fVar177 |
                                                                            (uint)!bVar18 *
                                                                            auVar122._16_4_,
                                                                            CONCAT412((uint)bVar17 *
                                                                                      (int)fVar99 |
                                                                                      (uint)!bVar17
                                                                                      * auVar122.
                                                  _12_4_,CONCAT48((uint)bVar16 * (int)fVar98 |
                                                                  (uint)!bVar16 * auVar122._8_4_,
                                                                  CONCAT44((uint)bVar15 *
                                                                           (int)fVar188 |
                                                                           (uint)!bVar15 *
                                                                           auVar122._4_4_,
                                                                           (uint)(bVar97 & 1) *
                                                                           (int)fVar178 |
                                                                           (uint)!(bool)(bVar97 & 1)
                                                                           * auVar122._0_4_))))))));
                auVar122 = vsubps_avx(auVar203,auVar71);
                bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar21 = SUB81(uVar89 >> 7,0);
                local_380._4_4_ = (uint)bVar15 * (int)fVar158 | (uint)!bVar15 * auVar122._4_4_;
                local_380._0_4_ =
                     (uint)(bVar97 & 1) * (int)fVar189 | (uint)!(bool)(bVar97 & 1) * auVar122._0_4_;
                local_380._8_4_ = (uint)bVar16 * (int)fVar196 | (uint)!bVar16 * auVar122._8_4_;
                local_380._12_4_ = (uint)bVar17 * (int)fVar197 | (uint)!bVar17 * auVar122._12_4_;
                local_380._16_4_ = (uint)bVar18 * (int)fVar152 | (uint)!bVar18 * auVar122._16_4_;
                local_380._20_4_ = (uint)bVar19 * (int)fVar154 | (uint)!bVar19 * auVar122._20_4_;
                local_380._24_4_ = (uint)bVar20 * (int)fVar155 | (uint)!bVar20 * auVar122._24_4_;
                local_380._28_4_ = (uint)bVar21 * auVar116._28_4_ | (uint)!bVar21 * auVar122._28_4_;
                in_ZMM21 = ZEXT3264(auVar123);
              }
            }
            auVar222 = ZEXT3264(local_700);
            if (local_430 != 0) {
              auVar122 = vsubps_avx(ZEXT1632(auVar102),auVar107);
              local_640 = in_ZMM20._0_32_;
              auVar122 = vfmadd213ps_avx512vl(auVar122,local_640,auVar107);
              auVar167._0_4_ = auVar122._0_4_ + auVar122._0_4_;
              auVar167._4_4_ = auVar122._4_4_ + auVar122._4_4_;
              auVar167._8_4_ = auVar122._8_4_ + auVar122._8_4_;
              auVar167._12_4_ = auVar122._12_4_ + auVar122._12_4_;
              auVar167._16_4_ = auVar122._16_4_ + auVar122._16_4_;
              auVar167._20_4_ = auVar122._20_4_ + auVar122._20_4_;
              auVar167._24_4_ = auVar122._24_4_ + auVar122._24_4_;
              auVar167._28_4_ = auVar122._28_4_ + auVar122._28_4_;
              uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar32._4_4_ = uVar159;
              auVar32._0_4_ = uVar159;
              auVar32._8_4_ = uVar159;
              auVar32._12_4_ = uVar159;
              auVar32._16_4_ = uVar159;
              auVar32._20_4_ = uVar159;
              auVar32._24_4_ = uVar159;
              auVar32._28_4_ = uVar159;
              auVar122 = vmulps_avx512vl(auVar167,auVar32);
              local_660 = in_ZMM21._0_32_;
              uVar160 = vcmpps_avx512vl(local_660,auVar122,6);
              local_430 = local_430 & (byte)uVar160;
              if (local_430 != 0) {
                auVar168._8_4_ = 0xbf800000;
                auVar168._0_8_ = 0xbf800000bf800000;
                auVar168._12_4_ = 0xbf800000;
                auVar168._16_4_ = 0xbf800000;
                auVar168._20_4_ = 0xbf800000;
                auVar168._24_4_ = 0xbf800000;
                auVar168._28_4_ = 0xbf800000;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_4c0 = vfmadd132ps_avx512vl(local_380,auVar168,auVar33);
                local_380 = local_4c0;
                auVar122 = local_380;
                local_480 = (undefined4)lVar94;
                local_460 = local_6b0._0_8_;
                uStack_458 = local_6b0._8_8_;
                local_450 = local_6c0._0_8_;
                uStack_448 = local_6c0._8_8_;
                local_440 = local_6d0;
                uStack_438 = uStack_6c8;
                pGVar12 = (context->scene->geometries).items[uVar95].ptr;
                local_380 = auVar122;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar122 = vaddps_avx512vl(local_640,_DAT_02020f40);
                  auVar103 = vcvtsi2ss_avx512f(auVar223._0_16_,local_480);
                  fVar189 = auVar103._0_4_;
                  local_420[0] = (fVar189 + auVar122._0_4_) * (float)local_5c0._0_4_;
                  local_420[1] = (fVar189 + auVar122._4_4_) * (float)local_5c0._4_4_;
                  local_420[2] = (fVar189 + auVar122._8_4_) * fStack_5b8;
                  local_420[3] = (fVar189 + auVar122._12_4_) * fStack_5b4;
                  fStack_410 = (fVar189 + auVar122._16_4_) * fStack_5b0;
                  fStack_40c = (fVar189 + auVar122._20_4_) * fStack_5ac;
                  fStack_408 = (fVar189 + auVar122._24_4_) * fStack_5a8;
                  fStack_404 = fVar189 + auVar122._28_4_;
                  local_380._0_8_ = local_4c0._0_8_;
                  local_380._8_8_ = local_4c0._8_8_;
                  local_380._16_8_ = local_4c0._16_8_;
                  local_380._24_8_ = local_4c0._24_8_;
                  local_400 = local_380._0_8_;
                  uStack_3f8 = local_380._8_8_;
                  uStack_3f0 = local_380._16_8_;
                  uStack_3e8 = local_380._24_8_;
                  local_3e0 = local_660;
                  auVar169._8_4_ = 0x7f800000;
                  auVar169._0_8_ = 0x7f8000007f800000;
                  auVar169._12_4_ = 0x7f800000;
                  auVar169._16_4_ = 0x7f800000;
                  auVar169._20_4_ = 0x7f800000;
                  auVar169._24_4_ = 0x7f800000;
                  auVar169._28_4_ = 0x7f800000;
                  auVar122 = vblendmps_avx512vl(auVar169,local_660);
                  auVar146._0_4_ =
                       (uint)(local_430 & 1) * auVar122._0_4_ |
                       (uint)!(bool)(local_430 & 1) * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 1 & 1);
                  auVar146._4_4_ = (uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 2 & 1);
                  auVar146._8_4_ = (uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 3 & 1);
                  auVar146._12_4_ = (uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 4 & 1);
                  auVar146._16_4_ = (uint)bVar15 * auVar122._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 5 & 1);
                  auVar146._20_4_ = (uint)bVar15 * auVar122._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_430 >> 6 & 1);
                  auVar146._24_4_ = (uint)bVar15 * auVar122._24_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar146._28_4_ =
                       (uint)(local_430 >> 7) * auVar122._28_4_ |
                       (uint)!(bool)(local_430 >> 7) * 0x7f800000;
                  auVar122 = vshufps_avx(auVar146,auVar146,0xb1);
                  auVar122 = vminps_avx(auVar146,auVar122);
                  auVar123 = vshufpd_avx(auVar122,auVar122,5);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  auVar123 = vpermpd_avx2(auVar122,0x4e);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  uVar160 = vcmpps_avx512vl(auVar146,auVar122,0);
                  bVar88 = (byte)uVar160 & local_430;
                  bVar97 = local_430;
                  if (bVar88 != 0) {
                    bVar97 = bVar88;
                  }
                  uVar211 = 0;
                  for (uVar91 = (uint)bVar97; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000)
                  {
                    uVar211 = uVar211 + 1;
                  }
                  uVar89 = (ulong)uVar211;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar189 = local_420[uVar89];
                    uVar159 = *(undefined4 *)((long)&local_400 + uVar89 * 4);
                    fVar196 = 1.0 - fVar189;
                    fVar158 = fVar196 * fVar196 * -3.0;
                    auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                               ZEXT416((uint)(fVar189 * fVar196)),
                                               ZEXT416(0xc0000000));
                    auVar102 = vfmsub132ss_fma(ZEXT416((uint)(fVar189 * fVar196)),
                                               ZEXT416((uint)(fVar189 * fVar189)),
                                               ZEXT416(0x40000000));
                    fVar196 = auVar103._0_4_ * 3.0;
                    fVar197 = auVar102._0_4_ * 3.0;
                    fVar178 = fVar189 * fVar189 * 3.0;
                    auVar199._0_4_ = fVar178 * (float)local_6d0._0_4_;
                    auVar199._4_4_ = fVar178 * (float)local_6d0._4_4_;
                    auVar199._8_4_ = fVar178 * (float)uStack_6c8;
                    auVar199._12_4_ = fVar178 * uStack_6c8._4_4_;
                    auVar175._4_4_ = fVar197;
                    auVar175._0_4_ = fVar197;
                    auVar175._8_4_ = fVar197;
                    auVar175._12_4_ = fVar197;
                    auVar103 = vfmadd132ps_fma(auVar175,auVar199,local_6c0);
                    auVar182._4_4_ = fVar196;
                    auVar182._0_4_ = fVar196;
                    auVar182._8_4_ = fVar196;
                    auVar182._12_4_ = fVar196;
                    auVar103 = vfmadd132ps_fma(auVar182,auVar103,local_6b0);
                    auVar176._4_4_ = fVar158;
                    auVar176._0_4_ = fVar158;
                    auVar176._8_4_ = fVar158;
                    auVar176._12_4_ = fVar158;
                    auVar103 = vfmadd213ps_fma(auVar176,auVar22,auVar103);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar103._0_4_;
                    uVar11 = vextractps_avx(auVar103,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                    uVar11 = vextractps_avx(auVar103,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar189;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar159;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar95;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5e0 = local_6b0._0_8_;
                    uStack_5d8 = local_6b0._8_8_;
                    local_5f0 = local_6c0._0_4_;
                    fStack_5ec = local_6c0._4_4_;
                    fStack_5e8 = local_6c0._8_4_;
                    fStack_5e4 = local_6c0._12_4_;
                    local_310 = local_6d0;
                    uStack_308 = uStack_6c8;
                    local_710 = lVar94;
                    local_4e0 = local_640;
                    local_4a0 = local_660;
                    local_47c = iVar10;
                    local_470 = auVar22;
                    bVar97 = local_430;
                    do {
                      auVar122 = local_3c0;
                      local_3c0._1_3_ = 0;
                      local_3c0[0] = bVar97;
                      auVar100 = auVar227._0_16_;
                      local_3c0._4_28_ = auVar122._4_28_;
                      local_5d0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_280 = local_420[uVar89];
                      local_260 = *(undefined4 *)((long)&local_400 + uVar89 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar89 * 4)
                      ;
                      local_740.context = context->user;
                      fVar158 = 1.0 - local_280;
                      fVar189 = fVar158 * fVar158 * -3.0;
                      auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),
                                                 ZEXT416((uint)(local_280 * fVar158)),
                                                 ZEXT416(0xc0000000));
                      auVar102 = vfmsub132ss_fma(ZEXT416((uint)(local_280 * fVar158)),
                                                 ZEXT416((uint)(local_280 * local_280)),
                                                 ZEXT416(0x40000000));
                      fVar158 = auVar103._0_4_ * 3.0;
                      fVar196 = auVar102._0_4_ * 3.0;
                      fVar197 = local_280 * local_280 * 3.0;
                      auVar200._0_4_ = fVar197 * (float)local_310;
                      auVar200._4_4_ = fVar197 * local_310._4_4_;
                      auVar200._8_4_ = fVar197 * (float)uStack_308;
                      auVar200._12_4_ = fVar197 * uStack_308._4_4_;
                      auVar161._4_4_ = fVar196;
                      auVar161._0_4_ = fVar196;
                      auVar161._8_4_ = fVar196;
                      auVar161._12_4_ = fVar196;
                      auVar82._4_4_ = fStack_5ec;
                      auVar82._0_4_ = local_5f0;
                      auVar82._8_4_ = fStack_5e8;
                      auVar82._12_4_ = fStack_5e4;
                      auVar103 = vfmadd132ps_fma(auVar161,auVar200,auVar82);
                      auVar183._4_4_ = fVar158;
                      auVar183._0_4_ = fVar158;
                      auVar183._8_4_ = fVar158;
                      auVar183._12_4_ = fVar158;
                      auVar83._8_8_ = uStack_5d8;
                      auVar83._0_8_ = local_5e0;
                      auVar103 = vfmadd132ps_fma(auVar183,auVar103,auVar83);
                      auVar162._4_4_ = fVar189;
                      auVar162._0_4_ = fVar189;
                      auVar162._8_4_ = fVar189;
                      auVar162._12_4_ = fVar189;
                      auVar103 = vfmadd213ps_fma(auVar162,auVar22,auVar103);
                      local_2e0 = auVar103._0_4_;
                      auVar194._8_4_ = 1;
                      auVar194._0_8_ = 0x100000001;
                      auVar194._12_4_ = 1;
                      auVar194._16_4_ = 1;
                      auVar194._20_4_ = 1;
                      auVar194._24_4_ = 1;
                      auVar194._28_4_ = 1;
                      local_2c0 = vpermps_avx2(auVar194,ZEXT1632(auVar103));
                      auVar204._8_4_ = 2;
                      auVar204._0_8_ = 0x200000002;
                      auVar204._12_4_ = 2;
                      auVar204._16_4_ = 2;
                      auVar204._20_4_ = 2;
                      auVar204._24_4_ = 2;
                      auVar204._28_4_ = 2;
                      local_2a0 = vpermps_avx2(auVar204,ZEXT1632(auVar103));
                      iStack_2dc = local_2e0;
                      iStack_2d8 = local_2e0;
                      iStack_2d4 = local_2e0;
                      iStack_2d0 = local_2e0;
                      iStack_2cc = local_2e0;
                      iStack_2c8 = local_2e0;
                      iStack_2c4 = local_2e0;
                      fStack_27c = local_280;
                      fStack_278 = local_280;
                      fStack_274 = local_280;
                      fStack_270 = local_280;
                      fStack_26c = local_280;
                      fStack_268 = local_280;
                      fStack_264 = local_280;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      local_240 = local_3a0._0_8_;
                      uStack_238 = local_3a0._8_8_;
                      uStack_230 = local_3a0._16_8_;
                      uStack_228 = local_3a0._24_8_;
                      local_220 = local_500;
                      auVar122 = vpcmpeqd_avx2(local_500,local_500);
                      local_708[1] = auVar122;
                      *local_708 = auVar122;
                      local_200 = (local_740.context)->instID[0];
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = (local_740.context)->instPrimID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_620 = local_300._0_8_;
                      uStack_618 = local_300._8_8_;
                      uStack_610 = local_300._16_8_;
                      uStack_608 = local_300._24_8_;
                      local_740.valid = (int *)&local_620;
                      local_740.geometryUserPtr = pGVar12->userPtr;
                      local_740.hit = (RTCHitN *)&local_2e0;
                      local_740.N = 8;
                      local_740.ray = (RTCRayN *)ray;
                      if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar12->intersectionFilterN)(&local_740);
                        auVar229 = ZEXT3264(local_6a0);
                        auVar228 = ZEXT3264(local_680);
                        auVar222 = ZEXT3264(local_700);
                        auVar224 = ZEXT3264(local_560);
                        auVar225 = ZEXT3264(local_540);
                        in_ZMM21 = ZEXT3264(local_660);
                        in_ZMM20 = ZEXT3264(local_640);
                        auVar103 = vxorps_avx512vl(auVar100,auVar100);
                        auVar227 = ZEXT1664(auVar103);
                        lVar94 = local_710;
                      }
                      auVar103 = auVar227._0_16_;
                      auVar78._8_8_ = uStack_618;
                      auVar78._0_8_ = local_620;
                      auVar78._16_8_ = uStack_610;
                      auVar78._24_8_ = uStack_608;
                      if (auVar78 == (undefined1  [32])0x0) {
LAB_01d20d6e:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5d0;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_740);
                          auVar229 = ZEXT3264(local_6a0);
                          auVar228 = ZEXT3264(local_680);
                          auVar222 = ZEXT3264(local_700);
                          auVar224 = ZEXT3264(local_560);
                          auVar225 = ZEXT3264(local_540);
                          in_ZMM21 = ZEXT3264(local_660);
                          in_ZMM20 = ZEXT3264(local_640);
                          auVar103 = vxorps_avx512vl(auVar103,auVar103);
                          auVar227 = ZEXT1664(auVar103);
                          lVar94 = local_710;
                        }
                        auVar79._8_8_ = uStack_618;
                        auVar79._0_8_ = local_620;
                        auVar79._16_8_ = uStack_610;
                        auVar79._24_8_ = uStack_608;
                        if (auVar79 == (undefined1  [32])0x0) goto LAB_01d20d6e;
                        uVar93 = vptestmd_avx512vl(auVar79,auVar79);
                        iVar1 = *(int *)(local_740.hit + 4);
                        iVar2 = *(int *)(local_740.hit + 8);
                        iVar73 = *(int *)(local_740.hit + 0xc);
                        iVar74 = *(int *)(local_740.hit + 0x10);
                        iVar75 = *(int *)(local_740.hit + 0x14);
                        iVar76 = *(int *)(local_740.hit + 0x18);
                        iVar77 = *(int *)(local_740.hit + 0x1c);
                        bVar97 = (byte)uVar93;
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                        bVar21 = SUB81(uVar93 >> 7,0);
                        *(uint *)(local_740.ray + 0x180) =
                             (uint)(bVar97 & 1) * *(int *)local_740.hit |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_740.ray + 0x180);
                        *(uint *)(local_740.ray + 0x184) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x184);
                        *(uint *)(local_740.ray + 0x188) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x188);
                        *(uint *)(local_740.ray + 0x18c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x18c)
                        ;
                        *(uint *)(local_740.ray + 400) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 400);
                        *(uint *)(local_740.ray + 0x194) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x194)
                        ;
                        *(uint *)(local_740.ray + 0x198) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x198)
                        ;
                        *(uint *)(local_740.ray + 0x19c) =
                             (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_740.hit + 0x24);
                        iVar2 = *(int *)(local_740.hit + 0x28);
                        iVar73 = *(int *)(local_740.hit + 0x2c);
                        iVar74 = *(int *)(local_740.hit + 0x30);
                        iVar75 = *(int *)(local_740.hit + 0x34);
                        iVar76 = *(int *)(local_740.hit + 0x38);
                        iVar77 = *(int *)(local_740.hit + 0x3c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                        bVar21 = SUB81(uVar93 >> 7,0);
                        *(uint *)(local_740.ray + 0x1a0) =
                             (uint)(bVar97 & 1) * *(int *)(local_740.hit + 0x20) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_740.ray + 0x1a0);
                        *(uint *)(local_740.ray + 0x1a4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1a4);
                        *(uint *)(local_740.ray + 0x1a8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1a8);
                        *(uint *)(local_740.ray + 0x1ac) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1ac)
                        ;
                        *(uint *)(local_740.ray + 0x1b0) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1b0)
                        ;
                        *(uint *)(local_740.ray + 0x1b4) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1b4)
                        ;
                        *(uint *)(local_740.ray + 0x1b8) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1b8)
                        ;
                        *(uint *)(local_740.ray + 0x1bc) =
                             (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_740.hit + 0x44);
                        iVar2 = *(int *)(local_740.hit + 0x48);
                        iVar73 = *(int *)(local_740.hit + 0x4c);
                        iVar74 = *(int *)(local_740.hit + 0x50);
                        iVar75 = *(int *)(local_740.hit + 0x54);
                        iVar76 = *(int *)(local_740.hit + 0x58);
                        iVar77 = *(int *)(local_740.hit + 0x5c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                        bVar21 = SUB81(uVar93 >> 7,0);
                        *(uint *)(local_740.ray + 0x1c0) =
                             (uint)(bVar97 & 1) * *(int *)(local_740.hit + 0x40) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_740.ray + 0x1c0);
                        *(uint *)(local_740.ray + 0x1c4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1c4);
                        *(uint *)(local_740.ray + 0x1c8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1c8);
                        *(uint *)(local_740.ray + 0x1cc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1cc)
                        ;
                        *(uint *)(local_740.ray + 0x1d0) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1d0)
                        ;
                        *(uint *)(local_740.ray + 0x1d4) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x1d4)
                        ;
                        *(uint *)(local_740.ray + 0x1d8) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1d8)
                        ;
                        *(uint *)(local_740.ray + 0x1dc) =
                             (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_740.hit + 100);
                        iVar2 = *(int *)(local_740.hit + 0x68);
                        iVar73 = *(int *)(local_740.hit + 0x6c);
                        iVar74 = *(int *)(local_740.hit + 0x70);
                        iVar75 = *(int *)(local_740.hit + 0x74);
                        iVar76 = *(int *)(local_740.hit + 0x78);
                        iVar77 = *(int *)(local_740.hit + 0x7c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                        bVar21 = SUB81(uVar93 >> 7,0);
                        *(uint *)(local_740.ray + 0x1e0) =
                             (uint)(bVar97 & 1) * *(int *)(local_740.hit + 0x60) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_740.ray + 0x1e0);
                        *(uint *)(local_740.ray + 0x1e4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x1e4);
                        *(uint *)(local_740.ray + 0x1e8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x1e8);
                        *(uint *)(local_740.ray + 0x1ec) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x1ec)
                        ;
                        *(uint *)(local_740.ray + 0x1f0) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x1f0)
                        ;
                        *(uint *)(local_740.ray + 500) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 500);
                        *(uint *)(local_740.ray + 0x1f8) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x1f8)
                        ;
                        *(uint *)(local_740.ray + 0x1fc) =
                             (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_740.hit + 0x84);
                        iVar2 = *(int *)(local_740.hit + 0x88);
                        iVar73 = *(int *)(local_740.hit + 0x8c);
                        iVar74 = *(int *)(local_740.hit + 0x90);
                        iVar75 = *(int *)(local_740.hit + 0x94);
                        iVar76 = *(int *)(local_740.hit + 0x98);
                        iVar77 = *(int *)(local_740.hit + 0x9c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar93 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar93 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar93 >> 6) & 1);
                        bVar21 = SUB81(uVar93 >> 7,0);
                        *(uint *)(local_740.ray + 0x200) =
                             (uint)(bVar97 & 1) * *(int *)(local_740.hit + 0x80) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_740.ray + 0x200);
                        *(uint *)(local_740.ray + 0x204) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_740.ray + 0x204);
                        *(uint *)(local_740.ray + 0x208) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_740.ray + 0x208);
                        *(uint *)(local_740.ray + 0x20c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_740.ray + 0x20c)
                        ;
                        *(uint *)(local_740.ray + 0x210) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_740.ray + 0x210)
                        ;
                        *(uint *)(local_740.ray + 0x214) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_740.ray + 0x214)
                        ;
                        *(uint *)(local_740.ray + 0x218) =
                             (uint)bVar20 * iVar76 | (uint)!bVar20 * *(int *)(local_740.ray + 0x218)
                        ;
                        *(uint *)(local_740.ray + 0x21c) =
                             (uint)bVar21 * iVar77 | (uint)!bVar21 * *(int *)(local_740.ray + 0x21c)
                        ;
                        auVar122 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xa0));
                        *(undefined1 (*) [32])(local_740.ray + 0x220) = auVar122;
                        auVar122 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xc0));
                        *(undefined1 (*) [32])(local_740.ray + 0x240) = auVar122;
                        auVar122 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0xe0));
                        *(undefined1 (*) [32])(local_740.ray + 0x260) = auVar122;
                        auVar122 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_740.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_740.ray + 0x280) = auVar122;
                      }
                      bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & local_3c0[0];
                      uVar159 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar34._4_4_ = uVar159;
                      auVar34._0_4_ = uVar159;
                      auVar34._8_4_ = uVar159;
                      auVar34._12_4_ = uVar159;
                      auVar34._16_4_ = uVar159;
                      auVar34._20_4_ = uVar159;
                      auVar34._24_4_ = uVar159;
                      auVar34._28_4_ = uVar159;
                      uVar160 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar34,2);
                      bVar97 = bVar88 & (byte)uVar160;
                      if ((bVar88 & (byte)uVar160) != 0) {
                        auVar170._8_4_ = 0x7f800000;
                        auVar170._0_8_ = 0x7f8000007f800000;
                        auVar170._12_4_ = 0x7f800000;
                        auVar170._16_4_ = 0x7f800000;
                        auVar170._20_4_ = 0x7f800000;
                        auVar170._24_4_ = 0x7f800000;
                        auVar170._28_4_ = 0x7f800000;
                        auVar122 = vblendmps_avx512vl(auVar170,in_ZMM21._0_32_);
                        auVar147._0_4_ =
                             (uint)(bVar97 & 1) * auVar122._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 1 & 1);
                        auVar147._4_4_ = (uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 2 & 1);
                        auVar147._8_4_ = (uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 3 & 1);
                        auVar147._12_4_ =
                             (uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 4 & 1);
                        auVar147._16_4_ =
                             (uint)bVar15 * auVar122._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 5 & 1);
                        auVar147._20_4_ =
                             (uint)bVar15 * auVar122._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar97 >> 6 & 1);
                        auVar147._24_4_ =
                             (uint)bVar15 * auVar122._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar147._28_4_ =
                             (uint)(bVar97 >> 7) * auVar122._28_4_ |
                             (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                        auVar122 = vshufps_avx(auVar147,auVar147,0xb1);
                        auVar122 = vminps_avx(auVar147,auVar122);
                        auVar123 = vshufpd_avx(auVar122,auVar122,5);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        auVar123 = vpermpd_avx2(auVar122,0x4e);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        uVar160 = vcmpps_avx512vl(auVar147,auVar122,0);
                        bVar87 = (byte)uVar160 & bVar97;
                        bVar88 = bVar97;
                        if (bVar87 != 0) {
                          bVar88 = bVar87;
                        }
                        uVar211 = 0;
                        for (uVar91 = (uint)bVar88; (uVar91 & 1) == 0;
                            uVar91 = uVar91 >> 1 | 0x80000000) {
                          uVar211 = uVar211 + 1;
                        }
                        uVar89 = (ulong)uVar211;
                      }
                    } while (bVar97 != 0);
                  }
                }
              }
            }
          }
          auVar208 = ZEXT3264(auVar110);
          auVar187 = ZEXT3264(auVar112);
          lVar94 = lVar94 + 8;
          auVar223 = auVar224;
        } while ((int)lVar94 < iVar10);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar3;
      auVar29._0_4_ = uVar3;
      auVar29._8_4_ = uVar3;
      auVar29._12_4_ = uVar3;
      auVar29._16_4_ = uVar3;
      auVar29._20_4_ = uVar3;
      auVar29._24_4_ = uVar3;
      auVar29._28_4_ = uVar3;
      uVar160 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar95 = (uint)uVar96 & (uint)uVar160;
      uVar96 = (ulong)uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }